

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_im2col_gemm_int8.h
# Opt level: O0

void ncnn::unpack_output_tile_int32(Mat *topT,Mat *top_blob,int i,int max_ii,int j,int max_jj)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [24];
  undefined1 *puVar34;
  undefined1 *puVar35;
  undefined1 *puVar36;
  undefined1 *puVar37;
  int iVar38;
  int iVar39;
  undefined1 (*pauVar40) [32];
  undefined1 (*pauVar41) [32];
  undefined1 (*pauVar42) [32];
  undefined1 (*pauVar43) [32];
  undefined1 (*pauVar44) [32];
  undefined1 (*pauVar45) [32];
  undefined8 *puVar46;
  int in_ECX;
  int iVar47;
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int f0_2;
  int f1_1;
  int f0_1;
  __m128i _f0_11;
  __m128i _f1_8;
  __m128i _f0_10;
  int jj_3;
  int *p0_3;
  int f1;
  int f0;
  int f11;
  int f10;
  int f01;
  int f00;
  __m128i _tmp1_15;
  __m128i _tmp0_15;
  __m128i _f1_7;
  __m128i _f0_9;
  __m128i _tmp3_11;
  __m128i _tmp2_11;
  __m128i _tmp1_14;
  __m128i _tmp0_14;
  __m128i _f3_4;
  __m128i _f2_4;
  __m128i _f1_6;
  __m128i _f0_8;
  int jj_2;
  int *p0_2;
  int sum0_3 [4];
  __m128i _f0_7;
  int sum1_1 [4];
  int sum0_2 [4];
  __m128i _tmp1_13;
  __m128i _tmp0_13;
  __m128i _f1_5;
  __m128i _f0_6;
  __m128i _tmp3_9;
  __m128i _tmp2_9;
  __m128i _tmp1_11;
  __m128i _tmp0_11;
  __m128i _f3_3;
  __m128i _f2_3;
  __m128i _f1_4;
  __m128i _f0_5;
  __m128i _tmp7_4;
  __m128i _tmp6_4;
  __m128i _tmp5_4;
  __m128i _tmp4_4;
  __m128i _tmp3_6;
  __m128i _tmp2_6;
  __m128i _tmp1_8;
  __m128i _tmp0_8;
  __m128i _f7_1;
  __m128i _f6_1;
  __m128i _f5_1;
  __m128i _f4_1;
  __m128i _f3_2;
  __m128i _f2_2;
  __m128i _f1_3;
  __m128i _f0_4;
  int jj_1;
  int *p0_1;
  int sum0_1 [8];
  __m256i _f0_3;
  __m128i _f0h;
  __m128i _f0l;
  int sum1 [8];
  int sum0 [8];
  __m256i _tmp1_7;
  __m256i _tmp0_7;
  __m256 _tmp1_6;
  __m256 _tmp0_6;
  __m256i _f1_2;
  __m256i _f0_2;
  __m256i _f01h_1;
  __m256i _f01l_1;
  __m256i _tmp3_4;
  __m256i _tmp2_4;
  __m256i _tmp1_4;
  __m256i _tmp0_4;
  __m256 _tmp3_3;
  __m256 _tmp2_3;
  __m256 _tmp1_3;
  __m256 _tmp0_3;
  __m256i _f3_1;
  __m256i _f2_1;
  __m256i _f1_1;
  __m256i _f0_1;
  __m256i _f23h;
  __m256i _f01h;
  __m256i _f23l;
  __m256i _f01l;
  __m256i _tmp7_1;
  __m256i _tmp6_1;
  __m256i _tmp5_1;
  __m256i _tmp4_1;
  __m256i _tmp3_1;
  __m256i _tmp2_1;
  __m256i _tmp1_1;
  __m256i _tmp0_1;
  __m256i _tmp7;
  __m256i _tmp6;
  __m256i _tmp5;
  __m256i _tmp4;
  __m256i _tmp3;
  __m256i _tmp2;
  __m256i _tmp1;
  __m256i _tmp0;
  __m256i _f7;
  __m256i _f6;
  __m256i _f5;
  __m256i _f4;
  __m256i _f3;
  __m256i _f2;
  __m256i _f1;
  __m256i _f0;
  int jj;
  int *p0;
  int *pp1;
  int ii;
  int *pp;
  int out_hstep;
  int out_elempack;
  __m128i _tmp3_10;
  __m128i _tmp2_10;
  __m128i _tmp1_12;
  __m128i _tmp0_12;
  __m128i _tmp3_8;
  __m128i _tmp2_8;
  __m128i _tmp1_10;
  __m128i _tmp0_10;
  __m128i _tmp3_7;
  __m128i _tmp2_7;
  __m128i _tmp1_9;
  __m128i _tmp0_9;
  __m256i _tmpf;
  __m256i _tmpe;
  __m256i _tmpd;
  __m256i _tmpc;
  __m256i _tmpb;
  __m256i _tmpa;
  __m256i _tmp9;
  __m256i _tmp8;
  __m256 _tmp7_2;
  __m256 _tmp6_2;
  __m256 _tmp5_2;
  __m256 _tmp4_2;
  __m256 _tmp3_2;
  __m256 _tmp2_2;
  __m256 _tmp1_2;
  __m256 _tmp0_2;
  __m256i _tmp7_3;
  __m256i _tmp6_3;
  __m256i _tmp5_3;
  __m256i _tmp4_3;
  __m256 _tmp3_5;
  __m256 _tmp2_5;
  __m256 _tmp1_5;
  __m256 _tmp0_5;
  int in_stack_ffffffffffffbac0;
  int in_stack_ffffffffffffbac4;
  int in_stack_ffffffffffffbac8;
  int in_stack_ffffffffffffbacc;
  undefined4 in_stack_ffffffffffffbad0;
  undefined4 in_stack_ffffffffffffbad4;
  undefined4 in_stack_ffffffffffffbad8;
  undefined4 in_stack_ffffffffffffbadc;
  int local_44e4;
  undefined8 *local_44e0;
  undefined8 local_4490;
  undefined8 uStack_4488;
  undefined8 local_4430;
  undefined8 uStack_4428;
  undefined8 local_4420;
  undefined8 uStack_4418;
  undefined8 local_4410;
  undefined8 uStack_4408;
  int local_43fc;
  undefined8 *local_43f8;
  undefined4 local_43f0;
  undefined4 uStack_43ec;
  undefined4 uStack_43e8;
  undefined4 uStack_43e4;
  undefined4 local_43d0;
  undefined4 uStack_43cc;
  undefined4 uStack_43c8;
  undefined4 uStack_43c4;
  undefined4 local_43c0;
  undefined4 uStack_43bc;
  undefined4 uStack_43b8;
  undefined4 uStack_43b4;
  undefined8 local_4380;
  undefined8 uStack_4378;
  undefined8 local_4320;
  undefined8 uStack_4318;
  undefined8 local_4310;
  undefined8 uStack_4308;
  undefined8 local_4300;
  undefined8 uStack_42f8;
  undefined8 local_4260;
  undefined8 uStack_4258;
  undefined8 local_4250;
  undefined8 uStack_4248;
  undefined8 local_4240;
  undefined8 uStack_4238;
  undefined8 local_4230;
  undefined8 uStack_4228;
  undefined8 local_4220;
  undefined8 uStack_4218;
  undefined8 local_4210;
  undefined8 uStack_4208;
  undefined8 local_4200;
  undefined8 uStack_41f8;
  int local_41ec;
  undefined1 (*local_41e8) [16];
  undefined4 local_41e0;
  undefined4 uStack_41dc;
  undefined4 uStack_41d8;
  undefined4 uStack_41d4;
  undefined4 uStack_41d0;
  undefined4 uStack_41cc;
  undefined4 uStack_41c8;
  undefined4 uStack_41c4;
  undefined8 local_41c0;
  undefined8 uStack_41b8;
  undefined8 uStack_41b0;
  undefined8 uStack_41a8;
  undefined4 local_4180;
  undefined4 uStack_417c;
  undefined4 uStack_4178;
  undefined4 uStack_4174;
  undefined4 uStack_4170;
  undefined4 uStack_416c;
  undefined4 uStack_4168;
  undefined4 uStack_4164;
  undefined4 local_4160;
  undefined4 uStack_415c;
  undefined4 uStack_4158;
  undefined4 uStack_4154;
  undefined4 uStack_4150;
  undefined4 uStack_414c;
  undefined4 uStack_4148;
  undefined4 uStack_4144;
  undefined8 local_40c0;
  undefined8 uStack_40b8;
  undefined8 local_4020;
  undefined8 uStack_4018;
  undefined8 uStack_4010;
  undefined8 uStack_4008;
  undefined8 local_3f40;
  undefined8 uStack_3f38;
  undefined8 local_3f20;
  undefined8 uStack_3f18;
  undefined8 uStack_3f10;
  undefined8 uStack_3f08;
  undefined1 local_3f00 [32];
  undefined8 local_3e20;
  undefined8 uStack_3e18;
  undefined8 uStack_3e10;
  undefined8 uStack_3e08;
  undefined8 local_3e00;
  undefined8 uStack_3df8;
  undefined8 uStack_3df0;
  undefined8 uStack_3de8;
  undefined8 local_3de0;
  undefined8 uStack_3dd8;
  undefined8 uStack_3dd0;
  undefined8 uStack_3dc8;
  undefined8 local_3c40;
  undefined8 uStack_3c38;
  undefined8 local_3c20;
  undefined8 uStack_3c18;
  undefined8 uStack_3c10;
  undefined8 uStack_3c08;
  undefined8 local_3c00;
  undefined8 uStack_3bf8;
  undefined8 uStack_3bf0;
  undefined8 uStack_3be8;
  undefined8 local_3be0;
  undefined8 uStack_3bd8;
  undefined8 uStack_3bd0;
  undefined8 uStack_3bc8;
  int local_3b2c;
  undefined1 (*local_3b28) [32];
  undefined1 (*local_3b20) [32];
  int local_3b14;
  undefined1 (*local_3b10) [32];
  undefined8 local_3060;
  undefined8 uStack_3058;
  undefined8 uStack_3050;
  undefined8 uStack_3048;
  undefined8 local_3020;
  undefined8 uStack_3018;
  undefined8 uStack_3010;
  undefined8 uStack_3008;
  undefined8 local_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  undefined8 local_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 local_2da0;
  undefined8 uStack_2d98;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_80;
  undefined8 uStack_78;
  
  iVar38 = cpu_support_x86_avx2();
  if (iVar38 == 0) {
    iVar38 = (int)in_RSI[3];
    iVar39 = (int)in_RSI[8];
    local_3b10 = (undefined1 (*) [32])*in_RDI;
    local_3b20 = (undefined1 (*) [32])(*local_3b10 + (long)(in_R9D << 2) * 4);
    for (local_3b14 = 0; local_3b14 + 7 < in_ECX; local_3b14 = local_3b14 + 8) {
      local_3b28 = (undefined1 (*) [32])
                   (*in_RSI + (long)((in_EDX + local_3b14) * iVar39) * 4 +
                   (long)(in_R8D * iVar38) * 4);
      for (local_3b2c = 0; local_3b2c + 7 < in_R9D; local_3b2c = local_3b2c + 8) {
        puVar35 = *local_3b10;
        puVar34 = *local_3b10;
        auVar23 = *local_3b10;
        pauVar40 = local_3b10 + 1;
        pauVar41 = local_3b10 + 2;
        pauVar42 = local_3b10 + 3;
        puVar36 = *local_3b20;
        auVar24 = *local_3b20;
        pauVar43 = local_3b20 + 1;
        auVar33 = *(undefined1 (*) [24])*pauVar43;
        pauVar44 = local_3b20 + 2;
        pauVar45 = local_3b20 + 3;
        local_3b10 = local_3b10 + 4;
        local_3b20 = local_3b20 + 4;
        auVar15 = vshufps_avx(*pauVar41,*pauVar41,0x93);
        auVar16 = vshufps_avx(*pauVar42,*pauVar42,0x93);
        local_3be0 = SUB248(*(undefined1 (*) [24])puVar36,0);
        uStack_3bd8 = SUB248(*(undefined1 (*) [24])puVar36,8);
        local_3c00 = auVar33._0_8_;
        uStack_3bf8 = auVar33._8_8_;
        auVar17 = vshufps_avx(*pauVar44,*pauVar44,0x93);
        local_2da0 = auVar17._0_8_;
        uStack_2d98 = auVar17._8_8_;
        auVar18 = vshufps_avx(*pauVar45,*pauVar45,0x93);
        local_2dc0 = auVar18._0_8_;
        uStack_2db8 = auVar18._8_8_;
        auVar23 = vperm2f128_avx(auVar23,auVar24,0x31);
        auVar24 = vperm2f128_avx(*pauVar40,*pauVar43,0x31);
        auVar25 = vperm2f128_avx(auVar15,auVar17,0x31);
        auVar26 = vperm2f128_avx(auVar16,auVar18,0x31);
        auVar20._16_8_ = local_3be0;
        auVar20._0_16_ = *(undefined1 (*) [16])puVar34;
        auVar20._24_8_ = uStack_3bd8;
        auVar19._16_8_ = local_2dc0;
        auVar19._0_16_ = auVar16._0_16_;
        auVar19._24_8_ = uStack_2db8;
        auVar19 = vunpcklps_avx(auVar20,auVar19);
        auVar18._16_8_ = local_3c00;
        auVar18._0_16_ = *(undefined1 (*) [16])*pauVar40;
        auVar18._24_8_ = uStack_3bf8;
        auVar17._16_8_ = local_2da0;
        auVar17._0_16_ = auVar15._0_16_;
        auVar17._24_8_ = uStack_2d98;
        auVar20 = vunpcklps_avx(auVar18,auVar17);
        auVar30._16_8_ = local_3c00;
        auVar30._0_16_ = *(undefined1 (*) [16])*pauVar40;
        auVar30._24_8_ = uStack_3bf8;
        auVar22._16_8_ = local_2da0;
        auVar22._0_16_ = auVar15._0_16_;
        auVar22._24_8_ = uStack_2d98;
        auVar17 = vunpckhps_avx(auVar30,auVar22);
        auVar21._16_8_ = local_3be0;
        auVar21._0_16_ = *(undefined1 (*) [16])puVar35;
        auVar21._24_8_ = uStack_3bd8;
        auVar15._16_8_ = local_2dc0;
        auVar15._0_16_ = auVar16._0_16_;
        auVar15._24_8_ = uStack_2db8;
        auVar16 = vunpckhps_avx(auVar21,auVar15);
        auVar21 = vunpcklps_avx(auVar23,auVar26);
        auVar22 = vunpcklps_avx(auVar24,auVar25);
        auVar18 = vunpckhps_avx(auVar24,auVar25);
        auVar23 = vunpckhps_avx(auVar23,auVar26);
        auVar24 = vunpcklpd_avx(auVar19,auVar20);
        local_1760 = auVar24._0_8_;
        uStack_1758 = auVar24._8_8_;
        uStack_1750 = auVar24._16_8_;
        uStack_1748 = auVar24._24_8_;
        auVar15 = vunpckhpd_avx(auVar19,auVar20);
        auVar19 = vunpcklpd_avx(auVar17,auVar16);
        local_17a0 = auVar19._0_8_;
        uStack_1798 = auVar19._8_8_;
        uStack_1790 = auVar19._16_8_;
        uStack_1788 = auVar19._24_8_;
        auVar16 = vunpckhpd_avx(auVar17,auVar16);
        auVar20 = vunpcklpd_avx(auVar21,auVar22);
        local_17e0 = auVar20._0_8_;
        uStack_17d8 = auVar20._8_8_;
        uStack_17d0 = auVar20._16_8_;
        uStack_17c8 = auVar20._24_8_;
        auVar17 = vunpckhpd_avx(auVar21,auVar22);
        auVar21 = vunpcklpd_avx(auVar18,auVar23);
        local_1820 = auVar21._0_8_;
        uStack_1818 = auVar21._8_8_;
        uStack_1810 = auVar21._16_8_;
        uStack_1808 = auVar21._24_8_;
        auVar18 = vunpckhpd_avx(auVar18,auVar23);
        auVar15 = vshufps_avx(auVar15,auVar15,0x93);
        local_2ee0 = auVar15._0_8_;
        uStack_2ed8 = auVar15._8_8_;
        uStack_2ed0 = auVar15._16_8_;
        uStack_2ec8 = auVar15._24_8_;
        auVar16 = vshufps_avx(auVar16,auVar16,0x93);
        local_2f00 = auVar16._0_8_;
        uStack_2ef8 = auVar16._8_8_;
        uStack_2ef0 = auVar16._16_8_;
        uStack_2ee8 = auVar16._24_8_;
        auVar17 = vshufps_avx(auVar17,auVar17,0x93);
        local_2f20 = auVar17._0_8_;
        uStack_2f18 = auVar17._8_8_;
        uStack_2f10 = auVar17._16_8_;
        uStack_2f08 = auVar17._24_8_;
        auVar18 = vshufps_avx(auVar18,auVar18,0x93);
        local_3c40 = auVar18._0_8_;
        uStack_3c38 = auVar18._8_8_;
        if (iVar38 == 8) {
          *(undefined8 *)*local_3b28 = local_1760;
          *(undefined8 *)(*local_3b28 + 8) = uStack_1758;
          *(undefined8 *)(*local_3b28 + 0x10) = uStack_1750;
          *(undefined8 *)(*local_3b28 + 0x18) = uStack_1748;
          *(undefined8 *)local_3b28[1] = local_2ee0;
          *(undefined8 *)(local_3b28[1] + 8) = uStack_2ed8;
          *(undefined8 *)(local_3b28[1] + 0x10) = uStack_2ed0;
          *(undefined8 *)(local_3b28[1] + 0x18) = uStack_2ec8;
          *(undefined8 *)local_3b28[2] = local_17a0;
          *(undefined8 *)(local_3b28[2] + 8) = uStack_1798;
          *(undefined8 *)(local_3b28[2] + 0x10) = uStack_1790;
          *(undefined8 *)(local_3b28[2] + 0x18) = uStack_1788;
          *(undefined8 *)local_3b28[3] = local_2f00;
          *(undefined8 *)(local_3b28[3] + 8) = uStack_2ef8;
          *(undefined8 *)(local_3b28[3] + 0x10) = uStack_2ef0;
          *(undefined8 *)(local_3b28[3] + 0x18) = uStack_2ee8;
          *(undefined8 *)local_3b28[4] = local_17e0;
          *(undefined8 *)(local_3b28[4] + 8) = uStack_17d8;
          *(undefined8 *)(local_3b28[4] + 0x10) = uStack_17d0;
          *(undefined8 *)(local_3b28[4] + 0x18) = uStack_17c8;
          *(undefined8 *)local_3b28[5] = local_2f20;
          *(undefined8 *)(local_3b28[5] + 8) = uStack_2f18;
          *(undefined8 *)(local_3b28[5] + 0x10) = uStack_2f10;
          *(undefined8 *)(local_3b28[5] + 0x18) = uStack_2f08;
          *(undefined8 *)local_3b28[6] = local_1820;
          *(undefined8 *)(local_3b28[6] + 8) = uStack_1818;
          *(undefined8 *)(local_3b28[6] + 0x10) = uStack_1810;
          *(undefined8 *)(local_3b28[6] + 0x18) = uStack_1808;
          local_3b28[7] = auVar18;
          local_3b28 = local_3b28 + 8;
        }
        if (iVar38 == 4) {
          auVar23 = vperm2f128_avx(auVar24,auVar15,0x31);
          auVar22 = vperm2f128_avx(auVar19,auVar16,0x31);
          auVar25 = vperm2f128_avx(auVar20,auVar17,0x31);
          auVar26 = vperm2f128_avx(auVar21,auVar18,0x31);
          *(undefined8 *)*local_3b28 = local_1760;
          *(undefined8 *)(*local_3b28 + 8) = uStack_1758;
          *(undefined8 *)(*local_3b28 + 0x10) = local_2ee0;
          *(undefined8 *)(*local_3b28 + 0x18) = uStack_2ed8;
          *(undefined8 *)local_3b28[1] = local_17a0;
          *(undefined8 *)(local_3b28[1] + 8) = uStack_1798;
          *(undefined8 *)(local_3b28[1] + 0x10) = local_2f00;
          *(undefined8 *)(local_3b28[1] + 0x18) = uStack_2ef8;
          *(undefined8 *)local_3b28[2] = local_17e0;
          *(undefined8 *)(local_3b28[2] + 8) = uStack_17d8;
          *(undefined8 *)(local_3b28[2] + 0x10) = local_2f20;
          *(undefined8 *)(local_3b28[2] + 0x18) = uStack_2f18;
          *(undefined8 *)local_3b28[3] = local_1820;
          *(undefined8 *)(local_3b28[3] + 8) = uStack_1818;
          *(undefined8 *)(local_3b28[3] + 0x10) = local_3c40;
          *(undefined8 *)(local_3b28[3] + 0x18) = uStack_3c38;
          puVar46 = (undefined8 *)(*local_3b28 + (long)(iVar39 << 2) * 4);
          local_3de0 = auVar23._0_8_;
          uStack_3dd8 = auVar23._8_8_;
          uStack_3dd0 = auVar23._16_8_;
          uStack_3dc8 = auVar23._24_8_;
          *puVar46 = local_3de0;
          puVar46[1] = uStack_3dd8;
          puVar46[2] = uStack_3dd0;
          puVar46[3] = uStack_3dc8;
          iVar47 = iVar39 << 2;
          local_3e00 = auVar22._0_8_;
          uStack_3df8 = auVar22._8_8_;
          uStack_3df0 = auVar22._16_8_;
          uStack_3de8 = auVar22._24_8_;
          *(undefined8 *)(local_3b28[1] + (long)iVar47 * 4) = local_3e00;
          *(undefined8 *)(local_3b28[1] + (long)iVar47 * 4 + 8) = uStack_3df8;
          *(undefined8 *)(local_3b28[1] + (long)iVar47 * 4 + 0x10) = uStack_3df0;
          *(undefined8 *)(local_3b28[1] + (long)iVar47 * 4 + 0x18) = uStack_3de8;
          iVar47 = iVar39 << 2;
          local_3e20 = auVar25._0_8_;
          uStack_3e18 = auVar25._8_8_;
          uStack_3e10 = auVar25._16_8_;
          uStack_3e08 = auVar25._24_8_;
          *(undefined8 *)(local_3b28[2] + (long)iVar47 * 4) = local_3e20;
          *(undefined8 *)(local_3b28[2] + (long)iVar47 * 4 + 8) = uStack_3e18;
          *(undefined8 *)(local_3b28[2] + (long)iVar47 * 4 + 0x10) = uStack_3e10;
          *(undefined8 *)(local_3b28[2] + (long)iVar47 * 4 + 0x18) = uStack_3e08;
          *(undefined1 (*) [32])(local_3b28[3] + (long)(iVar39 << 2) * 4) = auVar26;
          local_3b28 = local_3b28 + 4;
        }
        if (iVar38 == 1) {
          auVar22 = vunpcklps_avx(auVar24,auVar15);
          auVar23 = vunpckhps_avx(auVar24,auVar15);
          auVar15 = vunpcklps_avx(auVar19,auVar16);
          auVar16 = vunpckhps_avx(auVar19,auVar16);
          auVar25 = vunpcklps_avx(auVar20,auVar17);
          auVar24 = vunpckhps_avx(auVar20,auVar17);
          auVar17 = vunpcklps_avx(auVar21,auVar18);
          auVar18 = vunpckhps_avx(auVar21,auVar18);
          auVar19 = vunpcklpd_avx(auVar22,auVar15);
          local_420 = auVar19._0_8_;
          uStack_418 = auVar19._8_8_;
          auVar15 = vunpckhpd_avx(auVar22,auVar15);
          local_440 = auVar15._0_8_;
          uStack_438 = auVar15._8_8_;
          auVar20 = vunpcklpd_avx(auVar23,auVar16);
          local_460 = auVar20._0_8_;
          uStack_458 = auVar20._8_8_;
          auVar16 = vunpckhpd_avx(auVar23,auVar16);
          local_480 = auVar16._0_8_;
          uStack_478 = auVar16._8_8_;
          auVar23 = vunpcklpd_avx(auVar25,auVar17);
          local_4a0 = auVar23._0_8_;
          uStack_498 = auVar23._8_8_;
          auVar17 = vunpckhpd_avx(auVar25,auVar17);
          local_4c0 = auVar17._0_8_;
          uStack_4b8 = auVar17._8_8_;
          auVar21 = vunpcklpd_avx(auVar24,auVar18);
          local_4e0 = auVar21._0_8_;
          uStack_4d8 = auVar21._8_8_;
          auVar18 = vunpckhpd_avx(auVar24,auVar18);
          local_500 = auVar18._0_8_;
          uStack_4f8 = auVar18._8_8_;
          auVar23 = vperm2f128_avx(auVar19,auVar23,0x31);
          auVar15 = vperm2f128_avx(auVar15,auVar17,0x31);
          auVar17 = vperm2f128_avx(auVar20,auVar21,0x31);
          auVar16 = vperm2f128_avx(auVar16,auVar18,0x31);
          *(undefined8 *)*local_3b28 = local_420;
          *(undefined8 *)(*local_3b28 + 8) = uStack_418;
          *(undefined8 *)(*local_3b28 + 0x10) = local_4a0;
          *(undefined8 *)(*local_3b28 + 0x18) = uStack_498;
          puVar46 = (undefined8 *)(*local_3b28 + (long)iVar39 * 4);
          *puVar46 = local_440;
          puVar46[1] = uStack_438;
          puVar46[2] = local_4c0;
          puVar46[3] = uStack_4b8;
          puVar46 = (undefined8 *)(*local_3b28 + (long)(iVar39 << 1) * 4);
          *puVar46 = local_460;
          puVar46[1] = uStack_458;
          puVar46[2] = local_4e0;
          puVar46[3] = uStack_4d8;
          puVar46 = (undefined8 *)(*local_3b28 + (long)(iVar39 * 3) * 4);
          *puVar46 = local_480;
          puVar46[1] = uStack_478;
          puVar46[2] = local_500;
          puVar46[3] = uStack_4f8;
          puVar46 = (undefined8 *)(*local_3b28 + (long)(iVar39 << 2) * 4);
          local_3be0 = auVar23._0_8_;
          uStack_3bd8 = auVar23._8_8_;
          uStack_3bd0 = auVar23._16_8_;
          uStack_3bc8 = auVar23._24_8_;
          *puVar46 = local_3be0;
          puVar46[1] = uStack_3bd8;
          puVar46[2] = uStack_3bd0;
          puVar46[3] = uStack_3bc8;
          puVar46 = (undefined8 *)(*local_3b28 + (long)(iVar39 * 5) * 4);
          local_3c00 = auVar15._0_8_;
          uStack_3bf8 = auVar15._8_8_;
          uStack_3bf0 = auVar15._16_8_;
          uStack_3be8 = auVar15._24_8_;
          *puVar46 = local_3c00;
          puVar46[1] = uStack_3bf8;
          puVar46[2] = uStack_3bf0;
          puVar46[3] = uStack_3be8;
          puVar46 = (undefined8 *)(*local_3b28 + (long)(iVar39 * 6) * 4);
          local_3c20 = auVar17._0_8_;
          uStack_3c18 = auVar17._8_8_;
          uStack_3c10 = auVar17._16_8_;
          uStack_3c08 = auVar17._24_8_;
          *puVar46 = local_3c20;
          puVar46[1] = uStack_3c18;
          puVar46[2] = uStack_3c10;
          puVar46[3] = uStack_3c08;
          *(undefined1 (*) [32])(*local_3b28 + (long)(iVar39 * 7) * 4) = auVar16;
          local_3b28 = local_3b28 + 1;
        }
      }
      for (; local_3b2c + 3 < in_R9D; local_3b2c = local_3b2c + 4) {
        puVar35 = *local_3b10;
        puVar34 = *local_3b10;
        pauVar41 = local_3b10 + 1;
        puVar36 = *local_3b20;
        puVar37 = *local_3b20;
        uVar27 = *(undefined8 *)local_3b20[1];
        pauVar40 = local_3b20 + 1;
        auVar15 = vperm2f128_avx(*local_3b10,*local_3b20,0x31);
        auVar16 = vperm2f128_avx(*pauVar41,local_3b20[1],0x31);
        local_3b10 = local_3b10 + 2;
        local_3b20 = local_3b20 + 2;
        auVar15 = vshufps_avx(auVar15,auVar15,0x93);
        auVar16 = vshufps_avx(auVar16,auVar16,0x93);
        auVar23._16_8_ = *(undefined8 *)puVar36;
        auVar23._0_16_ = *(undefined1 (*) [16])puVar34;
        auVar23._24_8_ = *(undefined8 *)(puVar37 + 8);
        auVar23 = vunpcklps_avx(auVar23,auVar16);
        auVar26._16_8_ = *(undefined8 *)puVar36;
        auVar26._0_16_ = *(undefined1 (*) [16])puVar35;
        auVar26._24_8_ = *(undefined8 *)(puVar37 + 8);
        auVar16 = vunpckhps_avx(auVar26,auVar16);
        auVar24._16_8_ = uVar27;
        auVar24._0_16_ = *(undefined1 (*) [16])*pauVar41;
        auVar24._24_8_ = *(undefined8 *)(*pauVar40 + 8);
        auVar24 = vunpcklps_avx(auVar24,auVar15);
        auVar25._16_8_ = uVar27;
        auVar25._0_16_ = *(undefined1 (*) [16])*pauVar41;
        auVar25._24_8_ = *(undefined8 *)(*pauVar40 + 8);
        auVar17 = vunpckhps_avx(auVar25,auVar15);
        auVar18 = vunpcklpd_avx(auVar23,auVar24);
        local_2420 = auVar18._0_8_;
        uStack_2418 = auVar18._8_8_;
        uStack_2410 = auVar18._16_8_;
        uStack_2408 = auVar18._24_8_;
        auVar15 = vunpckhpd_avx(auVar23,auVar24);
        auVar23 = vunpcklpd_avx(auVar17,auVar16);
        local_2460 = auVar23._0_8_;
        uStack_2458 = auVar23._8_8_;
        uStack_2450 = auVar23._16_8_;
        uStack_2448 = auVar23._24_8_;
        auVar16 = vunpckhpd_avx(auVar17,auVar16);
        local_3f00 = vshufps_avx(auVar15,auVar15,0x93);
        local_3020 = local_3f00._0_8_;
        uStack_3018 = local_3f00._8_8_;
        uStack_3010 = local_3f00._16_8_;
        uStack_3008 = local_3f00._24_8_;
        auVar15 = vshufps_avx(auVar16,auVar16,0x93);
        local_3f40 = auVar15._0_8_;
        uStack_3f38 = auVar15._8_8_;
        if (iVar38 == 8) {
          *(undefined8 *)*local_3b28 = local_2420;
          *(undefined8 *)(*local_3b28 + 8) = uStack_2418;
          *(undefined8 *)(*local_3b28 + 0x10) = uStack_2410;
          *(undefined8 *)(*local_3b28 + 0x18) = uStack_2408;
          *(undefined8 *)local_3b28[1] = local_3020;
          *(undefined8 *)(local_3b28[1] + 8) = uStack_3018;
          *(undefined8 *)(local_3b28[1] + 0x10) = uStack_3010;
          *(undefined8 *)(local_3b28[1] + 0x18) = uStack_3008;
          *(undefined8 *)local_3b28[2] = local_2460;
          *(undefined8 *)(local_3b28[2] + 8) = uStack_2458;
          *(undefined8 *)(local_3b28[2] + 0x10) = uStack_2450;
          *(undefined8 *)(local_3b28[2] + 0x18) = uStack_2448;
          local_3b28[3] = auVar15;
          local_3b28 = local_3b28 + 4;
        }
        if (iVar38 == 4) {
          auVar16 = vperm2f128_avx(auVar18,local_3f00,0x31);
          auVar17 = vperm2f128_avx(auVar23,auVar15,0x31);
          *(undefined8 *)*local_3b28 = local_2420;
          *(undefined8 *)(*local_3b28 + 8) = uStack_2418;
          *(undefined8 *)(*local_3b28 + 0x10) = local_3020;
          *(undefined8 *)(*local_3b28 + 0x18) = uStack_3018;
          *(undefined8 *)local_3b28[1] = local_2460;
          *(undefined8 *)(local_3b28[1] + 8) = uStack_2458;
          *(undefined8 *)(local_3b28[1] + 0x10) = local_3f40;
          *(undefined8 *)(local_3b28[1] + 0x18) = uStack_3f38;
          puVar46 = (undefined8 *)(*local_3b28 + (long)(iVar39 << 2) * 4);
          local_4020 = auVar16._0_8_;
          uStack_4018 = auVar16._8_8_;
          uStack_4010 = auVar16._16_8_;
          uStack_4008 = auVar16._24_8_;
          *puVar46 = local_4020;
          puVar46[1] = uStack_4018;
          puVar46[2] = uStack_4010;
          puVar46[3] = uStack_4008;
          *(undefined1 (*) [32])(local_3b28[1] + (long)(iVar39 << 2) * 4) = auVar17;
          local_3b28 = local_3b28 + 2;
        }
        if (iVar38 == 1) {
          auVar24 = vunpcklps_avx(auVar18,local_3f00);
          auVar16 = vunpckhps_avx(auVar18,local_3f00);
          auVar19 = vunpcklps_avx(auVar23,auVar15);
          auVar17 = vunpckhps_avx(auVar23,auVar15);
          auVar18 = vunpcklpd_avx(auVar24,auVar19);
          local_80 = auVar18._0_8_;
          uStack_78 = auVar18._8_8_;
          auVar15 = vunpckhpd_avx(auVar24,auVar19);
          local_a0 = auVar15._0_8_;
          uStack_98 = auVar15._8_8_;
          auVar23 = vunpcklpd_avx(auVar16,auVar17);
          local_c0 = auVar23._0_8_;
          uStack_b8 = auVar23._8_8_;
          auVar16 = vunpckhpd_avx(auVar16,auVar17);
          local_e0 = auVar16._0_8_;
          uStack_d8 = auVar16._8_8_;
          local_3f00._0_8_ = local_c0;
          local_3f00._8_8_ = uStack_b8;
          local_3f00._16_8_ = local_e0;
          local_3f00._24_8_ = uStack_d8;
          auVar15 = vperm2f128_avx(auVar18,auVar15,0x31);
          uStack_3f08 = auVar15._24_8_;
          uStack_3f10 = auVar15._16_8_;
          uStack_3f18 = auVar15._8_8_;
          local_3f20 = auVar15._0_8_;
          auVar15 = vperm2f128_avx(auVar23,auVar16,0x31);
          *(undefined8 *)*local_3b28 = local_80;
          *(undefined8 *)(*local_3b28 + 8) = uStack_78;
          *(undefined8 *)(*local_3b28 + (long)iVar39 * 4) = local_a0;
          *(undefined8 *)((long)(*local_3b28 + (long)iVar39 * 4) + 8) = uStack_98;
          *(undefined8 *)(*local_3b28 + (long)(iVar39 * 2) * 4) = local_3f00._0_8_;
          *(undefined8 *)((long)(*local_3b28 + (long)(iVar39 * 2) * 4) + 8) = local_3f00._8_8_;
          *(undefined8 *)(*local_3b28 + (long)(iVar39 * 3) * 4) = local_3f00._16_8_;
          *(undefined8 *)((long)(*local_3b28 + (long)(iVar39 * 3) * 4) + 8) = local_3f00._24_8_;
          *(undefined8 *)(*local_3b28 + (long)(iVar39 << 2) * 4) = local_3f20;
          *(undefined8 *)((long)(*local_3b28 + (long)(iVar39 << 2) * 4) + 8) = uStack_3f18;
          *(undefined8 *)(*local_3b28 + (long)(iVar39 * 5) * 4) = uStack_3f10;
          *(undefined8 *)((long)(*local_3b28 + (long)(iVar39 * 5) * 4) + 8) = uStack_3f08;
          local_3f40 = auVar15._0_8_;
          uStack_3f38 = auVar15._8_8_;
          *(undefined8 *)(*local_3b28 + (long)(iVar39 * 6) * 4) = local_3f40;
          *(undefined8 *)((long)(*local_3b28 + (long)(iVar39 * 6) * 4) + 8) = uStack_3f38;
          *(undefined1 (*) [16])(*local_3b28 + (long)(iVar39 * 7) * 4) = auVar15._16_16_;
          local_3b28 = (undefined1 (*) [32])(*local_3b28 + 0x10);
        }
      }
      for (; local_3b2c + 1 < in_R9D; local_3b2c = local_3b2c + 2) {
        puVar35 = *local_3b10;
        puVar34 = *local_3b10;
        puVar36 = *local_3b20;
        puVar37 = *local_3b20;
        auVar16 = vperm2f128_avx(*local_3b10,*local_3b20,0x31);
        local_3b10 = local_3b10 + 1;
        local_3b20 = local_3b20 + 1;
        auVar32._16_8_ = *(undefined8 *)puVar36;
        auVar32._0_16_ = *(undefined1 (*) [16])puVar34;
        auVar32._24_8_ = *(undefined8 *)(puVar37 + 8);
        auVar31._16_8_ = *(undefined8 *)puVar36;
        auVar31._0_16_ = *(undefined1 (*) [16])puVar35;
        auVar31._24_8_ = *(undefined8 *)(puVar37 + 8);
        auVar15 = vshufps_avx(auVar32,auVar31,0xd8);
        auVar16 = vshufps_avx(auVar16,auVar16,0x2d);
        auVar17 = vunpcklps_avx(auVar15,auVar16);
        local_3060 = auVar17._0_8_;
        uStack_3058 = auVar17._8_8_;
        uStack_3050 = auVar17._16_8_;
        uStack_3048 = auVar17._24_8_;
        auVar15 = vunpckhps_avx(auVar15,auVar16);
        auVar15 = vshufps_avx(auVar15,auVar15,0x93);
        local_40c0 = auVar15._0_8_;
        uStack_40b8 = auVar15._8_8_;
        if (iVar38 == 8) {
          *(undefined8 *)*local_3b28 = local_3060;
          *(undefined8 *)(*local_3b28 + 8) = uStack_3058;
          *(undefined8 *)(*local_3b28 + 0x10) = uStack_3050;
          *(undefined8 *)(*local_3b28 + 0x18) = uStack_3048;
          local_3b28[1] = auVar15;
          local_3b28 = local_3b28 + 2;
        }
        if (iVar38 == 4) {
          auVar16 = vperm2f128_avx(auVar17,auVar15,0x31);
          *(undefined8 *)*local_3b28 = local_3060;
          *(undefined8 *)(*local_3b28 + 8) = uStack_3058;
          *(undefined8 *)(*local_3b28 + 0x10) = local_40c0;
          *(undefined8 *)(*local_3b28 + 0x18) = uStack_40b8;
          *(undefined1 (*) [32])(*local_3b28 + (long)(iVar39 << 2) * 4) = auVar16;
          local_3b28 = local_3b28 + 1;
        }
        if (iVar38 == 1) {
          uStack_415c = auVar17._4_4_;
          local_4160 = auVar17._0_4_;
          uStack_4154 = auVar17._12_4_;
          uStack_4158 = auVar17._8_4_;
          uStack_414c = auVar17._20_4_;
          uStack_4150 = auVar17._16_4_;
          uStack_4144 = auVar17._28_4_;
          uStack_4148 = auVar17._24_4_;
          uStack_4164 = auVar15._28_4_;
          uStack_4168 = auVar15._24_4_;
          uStack_416c = auVar15._20_4_;
          uStack_4170 = auVar15._16_4_;
          uStack_4174 = auVar15._12_4_;
          uStack_4178 = auVar15._8_4_;
          uStack_417c = auVar15._4_4_;
          local_4180 = auVar15._0_4_;
          *(undefined4 *)*local_3b28 = local_4160;
          *(undefined4 *)(*local_3b28 + 4) = local_4180;
          *(undefined4 *)(*local_3b28 + (long)iVar39 * 4) = uStack_415c;
          *(undefined4 *)(*local_3b28 + (long)(iVar39 + 1) * 4) = uStack_417c;
          *(undefined4 *)(*local_3b28 + (long)(iVar39 << 1) * 4) = uStack_4158;
          *(undefined4 *)(*local_3b28 + (long)(iVar39 * 2 + 1) * 4) = uStack_4178;
          *(undefined4 *)(*local_3b28 + (long)(iVar39 * 3) * 4) = uStack_4154;
          *(undefined4 *)(*local_3b28 + (long)(iVar39 * 3 + 1) * 4) = uStack_4174;
          *(undefined4 *)(*local_3b28 + (long)(iVar39 << 2) * 4) = uStack_4150;
          *(undefined4 *)(*local_3b28 + (long)(iVar39 * 4 + 1) * 4) = uStack_4170;
          *(undefined4 *)(*local_3b28 + (long)(iVar39 * 5) * 4) = uStack_414c;
          *(undefined4 *)(*local_3b28 + (long)(iVar39 * 5 + 1) * 4) = uStack_416c;
          *(undefined4 *)(*local_3b28 + (long)(iVar39 * 6) * 4) = uStack_4148;
          *(undefined4 *)(*local_3b28 + (long)(iVar39 * 6 + 1) * 4) = uStack_4168;
          *(undefined4 *)(*local_3b28 + (long)(iVar39 * 7) * 4) = uStack_4144;
          *(undefined4 *)(*local_3b28 + (long)(iVar39 * 7 + 1) * 4) = uStack_4164;
          local_3b28 = (undefined1 (*) [32])(*local_3b28 + 8);
        }
      }
      for (; local_3b2c < in_R9D; local_3b2c = local_3b2c + 1) {
        auVar4 = *(undefined1 (*) [16])*local_3b10;
        auVar5 = *(undefined1 (*) [16])*local_3b20;
        local_3b10 = (undefined1 (*) [32])(*local_3b10 + 0x10);
        local_3b20 = (undefined1 (*) [32])(*local_3b20 + 0x10);
        local_41c0 = auVar4._0_8_;
        uStack_41b8 = auVar4._8_8_;
        uStack_41b0 = auVar5._0_8_;
        uStack_41a8 = auVar5._8_8_;
        if (iVar38 == 8) {
          auVar16._16_8_ = uStack_41b0;
          auVar16._0_16_ = auVar4;
          auVar16._24_8_ = uStack_41a8;
          *local_3b28 = auVar16;
          local_3b28 = local_3b28 + 1;
        }
        if (iVar38 == 4) {
          *(undefined8 *)*local_3b28 = local_41c0;
          *(undefined8 *)(*local_3b28 + 8) = uStack_41b8;
          *(undefined1 (*) [16])(*local_3b28 + (long)(iVar39 << 2) * 4) = auVar5;
          local_3b28 = (undefined1 (*) [32])(*local_3b28 + 0x10);
        }
        if (iVar38 == 1) {
          uStack_41c4 = auVar5._12_4_;
          uStack_41c8 = auVar5._8_4_;
          uStack_41cc = auVar5._4_4_;
          uStack_41d0 = auVar5._0_4_;
          uStack_41d4 = auVar4._12_4_;
          uStack_41d8 = auVar4._8_4_;
          uStack_41dc = auVar4._4_4_;
          local_41e0 = auVar4._0_4_;
          *(undefined4 *)*local_3b28 = local_41e0;
          *(undefined4 *)(*local_3b28 + (long)iVar39 * 4) = uStack_41dc;
          *(undefined4 *)(*local_3b28 + (long)(iVar39 << 1) * 4) = uStack_41d8;
          *(undefined4 *)(*local_3b28 + (long)(iVar39 * 3) * 4) = uStack_41d4;
          *(undefined4 *)(*local_3b28 + (long)(iVar39 << 2) * 4) = uStack_41d0;
          *(undefined4 *)(*local_3b28 + (long)(iVar39 * 5) * 4) = uStack_41cc;
          *(undefined4 *)(*local_3b28 + (long)(iVar39 * 6) * 4) = uStack_41c8;
          *(undefined4 *)(*local_3b28 + (long)(iVar39 * 7) * 4) = uStack_41c4;
          local_3b28 = (undefined1 (*) [32])(*local_3b28 + 4);
        }
      }
      local_3b10 = local_3b20;
      local_3b20 = (undefined1 (*) [32])(*local_3b20 + (long)(in_R9D << 2) * 4);
    }
    for (; local_3b14 + 3 < in_ECX; local_3b14 = local_3b14 + 4) {
      local_41e8 = (undefined1 (*) [16])
                   (*in_RSI + (long)((in_EDX + local_3b14) * iVar39) * 4 +
                   (long)(in_R8D * iVar38) * 4);
      for (local_41ec = 0; local_41ec + 7 < in_R9D; local_41ec = local_41ec + 8) {
        auVar4 = vpshufd_avx(*(undefined1 (*) [16])local_3b10[2],0x93);
        auVar5 = vpshufd_avx(*(undefined1 (*) [16])(local_3b10[2] + 0x10),0x93);
        auVar6 = vpshufd_avx(*(undefined1 (*) [16])local_3b10[3],0x93);
        auVar7 = vpshufd_avx(*(undefined1 (*) [16])(local_3b10[3] + 0x10),0x93);
        auVar8 = vpunpckldq_avx(*(undefined1 (*) [16])*local_3b10,auVar6);
        auVar6 = vpunpckhdq_avx(*(undefined1 (*) [16])*local_3b10,auVar6);
        auVar9 = vpunpckldq_avx(*(undefined1 (*) [16])(*local_3b10 + 0x10),auVar7);
        auVar7 = vpunpckhdq_avx(*(undefined1 (*) [16])(*local_3b10 + 0x10),auVar7);
        auVar10 = vpunpckldq_avx(*(undefined1 (*) [16])local_3b10[1],auVar4);
        auVar4 = vpunpckhdq_avx(*(undefined1 (*) [16])local_3b10[1],auVar4);
        auVar11 = vpunpckldq_avx(*(undefined1 (*) [16])(local_3b10[1] + 0x10),auVar5);
        auVar5 = vpunpckhdq_avx(*(undefined1 (*) [16])(local_3b10[1] + 0x10),auVar5);
        auVar12 = vpunpcklqdq_avx(auVar8,auVar10);
        auVar8 = vpunpckhqdq_avx(auVar8,auVar10);
        auVar10 = vpunpcklqdq_avx(auVar4,auVar6);
        auVar6 = vpunpckhqdq_avx(auVar4,auVar6);
        auVar13 = vpunpcklqdq_avx(auVar9,auVar11);
        auVar9 = vpunpckhqdq_avx(auVar9,auVar11);
        auVar11 = vpunpcklqdq_avx(auVar5,auVar7);
        auVar7 = vpunpckhqdq_avx(auVar5,auVar7);
        auVar4 = vpshufd_avx(auVar8,0x93);
        auVar5 = vpshufd_avx(auVar6,0x93);
        auVar6 = vpshufd_avx(auVar9,0x93);
        auVar7 = vpshufd_avx(auVar7,0x93);
        if (iVar38 == 4) {
          local_4200 = auVar12._0_8_;
          uStack_41f8 = auVar12._8_8_;
          *(undefined8 *)*local_41e8 = local_4200;
          *(undefined8 *)(*local_41e8 + 8) = uStack_41f8;
          local_4210 = auVar4._0_8_;
          uStack_4208 = auVar4._8_8_;
          *(undefined8 *)local_41e8[1] = local_4210;
          *(undefined8 *)(local_41e8[1] + 8) = uStack_4208;
          local_4220 = auVar10._0_8_;
          uStack_4218 = auVar10._8_8_;
          *(undefined8 *)local_41e8[2] = local_4220;
          *(undefined8 *)(local_41e8[2] + 8) = uStack_4218;
          local_4230 = auVar5._0_8_;
          uStack_4228 = auVar5._8_8_;
          *(undefined8 *)local_41e8[3] = local_4230;
          *(undefined8 *)(local_41e8[3] + 8) = uStack_4228;
          local_4240 = auVar13._0_8_;
          uStack_4238 = auVar13._8_8_;
          *(undefined8 *)local_41e8[4] = local_4240;
          *(undefined8 *)(local_41e8[4] + 8) = uStack_4238;
          local_4250 = auVar6._0_8_;
          uStack_4248 = auVar6._8_8_;
          *(undefined8 *)local_41e8[5] = local_4250;
          *(undefined8 *)(local_41e8[5] + 8) = uStack_4248;
          local_4260 = auVar11._0_8_;
          uStack_4258 = auVar11._8_8_;
          *(undefined8 *)local_41e8[6] = local_4260;
          *(undefined8 *)(local_41e8[6] + 8) = uStack_4258;
          local_41e8[7] = auVar7;
          local_41e8 = local_41e8 + 8;
        }
        if (iVar38 == 1) {
          auVar8 = vpunpckldq_avx(auVar12,auVar4);
          auVar4 = vpunpckhdq_avx(auVar12,auVar4);
          auVar9 = vpunpckldq_avx(auVar10,auVar5);
          auVar5 = vpunpckhdq_avx(auVar10,auVar5);
          auVar12 = vpunpcklqdq_avx(auVar8,auVar9);
          auVar8 = vpunpckhqdq_avx(auVar8,auVar9);
          auVar14 = vpunpcklqdq_avx(auVar4,auVar5);
          auVar9 = vpunpckhqdq_avx(auVar4,auVar5);
          auVar10 = vpunpckldq_avx(auVar13,auVar6);
          auVar4 = vpunpckhdq_avx(auVar13,auVar6);
          auVar6 = vpunpckldq_avx(auVar11,auVar7);
          auVar5 = vpunpckhdq_avx(auVar11,auVar7);
          auVar7 = vpunpcklqdq_avx(auVar10,auVar6);
          auVar6 = vpunpckhqdq_avx(auVar10,auVar6);
          auVar10 = vpunpcklqdq_avx(auVar4,auVar5);
          auVar4 = vpunpckhqdq_avx(auVar4,auVar5);
          local_4200 = auVar12._0_8_;
          uStack_41f8 = auVar12._8_8_;
          *(undefined8 *)*local_41e8 = local_4200;
          *(undefined8 *)(*local_41e8 + 8) = uStack_41f8;
          local_4240 = auVar7._0_8_;
          uStack_4238 = auVar7._8_8_;
          *(undefined8 *)local_41e8[1] = local_4240;
          *(undefined8 *)(local_41e8[1] + 8) = uStack_4238;
          local_4210 = auVar8._0_8_;
          uStack_4208 = auVar8._8_8_;
          *(undefined8 *)(*local_41e8 + (long)iVar39 * 4) = local_4210;
          *(undefined8 *)((long)(*local_41e8 + (long)iVar39 * 4) + 8) = uStack_4208;
          local_4250 = auVar6._0_8_;
          uStack_4248 = auVar6._8_8_;
          *(undefined8 *)(local_41e8[1] + (long)iVar39 * 4) = local_4250;
          *(undefined8 *)(local_41e8[1] + (long)iVar39 * 4 + 8) = uStack_4248;
          local_4220 = auVar14._0_8_;
          uStack_4218 = auVar14._8_8_;
          *(undefined8 *)(*local_41e8 + (long)(iVar39 << 1) * 4) = local_4220;
          *(undefined8 *)((long)(*local_41e8 + (long)(iVar39 << 1) * 4) + 8) = uStack_4218;
          local_4260 = auVar10._0_8_;
          uStack_4258 = auVar10._8_8_;
          *(undefined8 *)(local_41e8[1] + (long)(iVar39 << 1) * 4) = local_4260;
          *(undefined8 *)(local_41e8[1] + (long)(iVar39 << 1) * 4 + 8) = uStack_4258;
          local_4230 = auVar9._0_8_;
          uStack_4228 = auVar9._8_8_;
          *(undefined8 *)(*local_41e8 + (long)(iVar39 * 3) * 4) = local_4230;
          *(undefined8 *)((long)(*local_41e8 + (long)(iVar39 * 3) * 4) + 8) = uStack_4228;
          *(undefined1 (*) [16])(local_41e8[1] + (long)(iVar39 * 3) * 4) = auVar4;
          local_41e8 = local_41e8 + 2;
        }
        local_3b10 = local_3b10 + 4;
      }
      for (; local_41ec + 3 < in_R9D; local_41ec = local_41ec + 4) {
        auVar4 = vpshufd_avx(*(undefined1 (*) [16])(*local_3b10 + 0x10),0x93);
        auVar5 = vpshufd_avx(*(undefined1 (*) [16])(local_3b10[1] + 0x10),0x93);
        auVar6 = vpunpckldq_avx(*(undefined1 (*) [16])*local_3b10,auVar5);
        auVar5 = vpunpckhdq_avx(*(undefined1 (*) [16])*local_3b10,auVar5);
        auVar7 = vpunpckldq_avx(*(undefined1 (*) [16])local_3b10[1],auVar4);
        auVar4 = vpunpckhdq_avx(*(undefined1 (*) [16])local_3b10[1],auVar4);
        auVar8 = vpunpcklqdq_avx(auVar6,auVar7);
        auVar6 = vpunpckhqdq_avx(auVar6,auVar7);
        auVar7 = vpunpcklqdq_avx(auVar4,auVar5);
        auVar5 = vpunpckhqdq_avx(auVar4,auVar5);
        auVar4 = vpshufd_avx(auVar6,0x93);
        auVar5 = vpshufd_avx(auVar5,0x93);
        if (iVar38 == 4) {
          local_4300 = auVar8._0_8_;
          uStack_42f8 = auVar8._8_8_;
          *(undefined8 *)*local_41e8 = local_4300;
          *(undefined8 *)(*local_41e8 + 8) = uStack_42f8;
          local_4310 = auVar4._0_8_;
          uStack_4308 = auVar4._8_8_;
          *(undefined8 *)local_41e8[1] = local_4310;
          *(undefined8 *)(local_41e8[1] + 8) = uStack_4308;
          local_4320 = auVar7._0_8_;
          uStack_4318 = auVar7._8_8_;
          *(undefined8 *)local_41e8[2] = local_4320;
          *(undefined8 *)(local_41e8[2] + 8) = uStack_4318;
          local_41e8[3] = auVar5;
          local_41e8 = local_41e8 + 4;
        }
        if (iVar38 == 1) {
          auVar6 = vpunpckldq_avx(auVar8,auVar4);
          auVar4 = vpunpckhdq_avx(auVar8,auVar4);
          auVar8 = vpunpckldq_avx(auVar7,auVar5);
          auVar5 = vpunpckhdq_avx(auVar7,auVar5);
          auVar7 = vpunpcklqdq_avx(auVar6,auVar8);
          auVar6 = vpunpckhqdq_avx(auVar6,auVar8);
          auVar8 = vpunpcklqdq_avx(auVar4,auVar5);
          auVar4 = vpunpckhqdq_avx(auVar4,auVar5);
          local_4300 = auVar7._0_8_;
          uStack_42f8 = auVar7._8_8_;
          *(undefined8 *)*local_41e8 = local_4300;
          *(undefined8 *)(*local_41e8 + 8) = uStack_42f8;
          local_4310 = auVar6._0_8_;
          uStack_4308 = auVar6._8_8_;
          *(undefined8 *)(*local_41e8 + (long)iVar39 * 4) = local_4310;
          *(undefined8 *)((long)(*local_41e8 + (long)iVar39 * 4) + 8) = uStack_4308;
          local_4320 = auVar8._0_8_;
          uStack_4318 = auVar8._8_8_;
          *(undefined8 *)(*local_41e8 + (long)(iVar39 << 1) * 4) = local_4320;
          *(undefined8 *)((long)(*local_41e8 + (long)(iVar39 << 1) * 4) + 8) = uStack_4318;
          *(undefined1 (*) [16])(*local_41e8 + (long)(iVar39 * 3) * 4) = auVar4;
          local_41e8 = local_41e8 + 1;
        }
        local_3b10 = local_3b10 + 2;
      }
      for (; local_41ec + 1 < in_R9D; local_41ec = local_41ec + 2) {
        auVar4 = vpshufd_avx(*(undefined1 (*) [16])*local_3b10,0xd8);
        auVar5 = vpshufd_avx(*(undefined1 (*) [16])(*local_3b10 + 0x10),0x2d);
        auVar6 = vpunpckldq_avx(auVar4,auVar5);
        auVar4 = vpunpckhdq_avx(auVar4,auVar5);
        auVar4 = vpshufd_avx(auVar4,0x93);
        local_4380 = auVar6._0_8_;
        uStack_4378 = auVar6._8_8_;
        if (iVar38 == 4) {
          *(undefined8 *)*local_41e8 = local_4380;
          *(undefined8 *)(*local_41e8 + 8) = uStack_4378;
          local_41e8[1] = auVar4;
          local_41e8 = local_41e8 + 2;
        }
        if (iVar38 == 1) {
          uStack_43bc = auVar6._4_4_;
          local_43c0 = auVar6._0_4_;
          uStack_43b4 = auVar6._12_4_;
          uStack_43b8 = auVar6._8_4_;
          uStack_43c4 = auVar4._12_4_;
          uStack_43c8 = auVar4._8_4_;
          uStack_43cc = auVar4._4_4_;
          local_43d0 = auVar4._0_4_;
          *(undefined4 *)*local_41e8 = local_43c0;
          *(undefined4 *)(*local_41e8 + 4) = local_43d0;
          *(undefined4 *)(*local_41e8 + (long)iVar39 * 4) = uStack_43bc;
          *(undefined4 *)(*local_41e8 + (long)(iVar39 + 1) * 4) = uStack_43cc;
          *(undefined4 *)(*local_41e8 + (long)(iVar39 << 1) * 4) = uStack_43b8;
          *(undefined4 *)(*local_41e8 + (long)(iVar39 * 2 + 1) * 4) = uStack_43c8;
          *(undefined4 *)(*local_41e8 + (long)(iVar39 * 3) * 4) = uStack_43b4;
          *(undefined4 *)(*local_41e8 + (long)(iVar39 * 3 + 1) * 4) = uStack_43c4;
          local_41e8 = (undefined1 (*) [16])(*local_41e8 + 8);
        }
        local_3b10 = local_3b10 + 1;
      }
      for (; local_41ec < in_R9D; local_41ec = local_41ec + 1) {
        auVar4 = *(undefined1 (*) [16])*local_3b10;
        if (iVar38 == 4) {
          *local_41e8 = auVar4;
          local_41e8 = local_41e8 + 1;
        }
        if (iVar38 == 1) {
          uStack_43e4 = auVar4._12_4_;
          uStack_43e8 = auVar4._8_4_;
          uStack_43ec = auVar4._4_4_;
          local_43f0 = auVar4._0_4_;
          *(undefined4 *)*local_41e8 = local_43f0;
          *(undefined4 *)(*local_41e8 + (long)iVar39 * 4) = uStack_43ec;
          *(undefined4 *)(*local_41e8 + (long)(iVar39 << 1) * 4) = uStack_43e8;
          *(undefined4 *)(*local_41e8 + (long)(iVar39 * 3) * 4) = uStack_43e4;
          local_41e8 = (undefined1 (*) [16])(*local_41e8 + 4);
        }
        local_3b10 = (undefined1 (*) [32])(*local_3b10 + 0x10);
      }
    }
    for (; local_3b14 + 1 < in_ECX; local_3b14 = local_3b14 + 2) {
      local_43f8 = (undefined8 *)
                   (*in_RSI + (long)((in_EDX + local_3b14) * iVar39) * 4 + (long)in_R8D * 4);
      for (local_43fc = 0; local_43fc + 7 < in_R9D; local_43fc = local_43fc + 8) {
        auVar4 = vpshufd_avx(*(undefined1 (*) [16])local_3b10[1],0xb1);
        auVar5 = vpshufd_avx(*(undefined1 (*) [16])(local_3b10[1] + 0x10),0xb1);
        auVar6 = vpunpckldq_avx(*(undefined1 (*) [16])*local_3b10,auVar4);
        auVar4 = vpunpckhdq_avx(*(undefined1 (*) [16])*local_3b10,auVar4);
        auVar7 = vpunpckldq_avx(*(undefined1 (*) [16])(*local_3b10 + 0x10),auVar5);
        auVar5 = vpunpckhdq_avx(*(undefined1 (*) [16])(*local_3b10 + 0x10),auVar5);
        auVar8 = vpunpcklqdq_avx(auVar6,auVar4);
        auVar9 = vpunpcklqdq_avx(auVar7,auVar5);
        auVar4 = vpunpckhqdq_avx(auVar6,auVar4);
        auVar5 = vpunpckhqdq_avx(auVar7,auVar5);
        auVar4 = vpshufd_avx(auVar4,0xb1);
        auVar5 = vpshufd_avx(auVar5,0xb1);
        local_4410 = auVar8._0_8_;
        uStack_4408 = auVar8._8_8_;
        *local_43f8 = local_4410;
        local_43f8[1] = uStack_4408;
        local_4420 = auVar9._0_8_;
        uStack_4418 = auVar9._8_8_;
        local_43f8[2] = local_4420;
        local_43f8[3] = uStack_4418;
        puVar46 = (undefined8 *)((long)local_43f8 + (long)iVar39 * 4);
        local_4430 = auVar4._0_8_;
        uStack_4428 = auVar4._8_8_;
        *puVar46 = local_4430;
        puVar46[1] = uStack_4428;
        *(undefined1 (*) [16])((long)local_43f8 + (long)iVar39 * 4 + 0x10) = auVar5;
        local_43f8 = local_43f8 + 4;
        local_3b10 = local_3b10 + 2;
      }
      for (; local_43fc + 3 < in_R9D; local_43fc = local_43fc + 4) {
        auVar5 = vpunpckldq_avx(*(undefined1 (*) [16])*local_3b10,
                                *(undefined1 (*) [16])(*local_3b10 + 0x10));
        auVar4 = vpunpckhdq_avx(*(undefined1 (*) [16])*local_3b10,
                                *(undefined1 (*) [16])(*local_3b10 + 0x10));
        auVar6 = vpunpcklqdq_avx(auVar5,auVar4);
        auVar4 = vpunpckhqdq_avx(auVar4,auVar5);
        auVar4 = vpshufd_avx(auVar4,0x39);
        local_4490 = auVar6._0_8_;
        uStack_4488 = auVar6._8_8_;
        *local_43f8 = local_4490;
        local_43f8[1] = uStack_4488;
        *(undefined1 (*) [16])((long)local_43f8 + (long)iVar39 * 4) = auVar4;
        local_43f8 = local_43f8 + 2;
        local_3b10 = local_3b10 + 1;
      }
      for (; local_43fc + 1 < in_R9D; local_43fc = local_43fc + 2) {
        uVar1 = *(undefined4 *)(*local_3b10 + 4);
        uVar2 = *(undefined4 *)(*local_3b10 + 8);
        uVar3 = *(undefined4 *)(*local_3b10 + 0xc);
        *(undefined4 *)local_43f8 = *(undefined4 *)*local_3b10;
        *(undefined4 *)((long)local_43f8 + 4) = uVar1;
        *(undefined4 *)((long)local_43f8 + (long)iVar39 * 4) = uVar2;
        *(undefined4 *)((long)local_43f8 + (long)(iVar39 + 1) * 4) = uVar3;
        local_43f8 = local_43f8 + 1;
        local_3b10 = (undefined1 (*) [32])(*local_3b10 + 0x10);
      }
      for (; local_43fc < in_R9D; local_43fc = local_43fc + 1) {
        uVar1 = *(undefined4 *)(*local_3b10 + 4);
        *(undefined4 *)local_43f8 = *(undefined4 *)*local_3b10;
        *(undefined4 *)((long)local_43f8 + (long)iVar39 * 4) = uVar1;
        local_43f8 = (undefined8 *)((long)local_43f8 + 4);
        local_3b10 = (undefined1 (*) [32])(*local_3b10 + 8);
      }
    }
    for (; local_3b14 < in_ECX; local_3b14 = local_3b14 + 1) {
      local_44e0 = (undefined8 *)
                   (*in_RSI + (long)((in_EDX + local_3b14) * iVar39) * 4 + (long)in_R8D * 4);
      for (local_44e4 = 0; local_44e4 + 7 < in_R9D; local_44e4 = local_44e4 + 8) {
        uVar27 = *(undefined8 *)(*local_3b10 + 8);
        uVar28 = *(undefined8 *)(*local_3b10 + 0x10);
        uVar29 = *(undefined8 *)(*local_3b10 + 0x18);
        *local_44e0 = *(undefined8 *)*local_3b10;
        local_44e0[1] = uVar27;
        local_44e0[2] = uVar28;
        local_44e0[3] = uVar29;
        local_44e0 = local_44e0 + 4;
        local_3b10 = local_3b10 + 1;
      }
      for (; local_44e4 + 3 < in_R9D; local_44e4 = local_44e4 + 4) {
        uVar27 = *(undefined8 *)(*local_3b10 + 8);
        *local_44e0 = *(undefined8 *)*local_3b10;
        local_44e0[1] = uVar27;
        local_44e0 = local_44e0 + 2;
        local_3b10 = (undefined1 (*) [32])(*local_3b10 + 0x10);
      }
      for (; local_44e4 + 1 < in_R9D; local_44e4 = local_44e4 + 2) {
        uVar1 = *(undefined4 *)(*local_3b10 + 4);
        *(undefined4 *)local_44e0 = *(undefined4 *)*local_3b10;
        *(undefined4 *)((long)local_44e0 + 4) = uVar1;
        local_44e0 = local_44e0 + 1;
        local_3b10 = (undefined1 (*) [32])(*local_3b10 + 8);
      }
      for (; local_44e4 < in_R9D; local_44e4 = local_44e4 + 1) {
        *(undefined4 *)local_44e0 = *(undefined4 *)*local_3b10;
        local_44e0 = (undefined8 *)((long)local_44e0 + 4);
        local_3b10 = (undefined1 (*) [32])(*local_3b10 + 4);
      }
    }
  }
  else {
    unpack_output_tile_int32_avx2
              ((Mat *)CONCAT44(in_stack_ffffffffffffbadc,in_stack_ffffffffffffbad8),
               (Mat *)CONCAT44(in_stack_ffffffffffffbad4,in_stack_ffffffffffffbad0),
               in_stack_ffffffffffffbacc,in_stack_ffffffffffffbac8,in_stack_ffffffffffffbac4,
               in_stack_ffffffffffffbac0);
  }
  return;
}

Assistant:

static void unpack_output_tile_int32(const Mat& topT, Mat& top_blob, int i, int max_ii, int j, int max_jj)
{
#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__ && !__AVXVNNI__ && !__AVXVNNIINT8__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx2())
    {
        unpack_output_tile_int32_avx2(topT, top_blob, i, max_ii, j, max_jj);
        return;
    }
#endif

    const int out_elempack = top_blob.elempack;
    // const int out_hstep = top_blob.dims == 3 ? (int)top_blob.cstep : top_blob.w;
    const int out_hstep = top_blob.cstep;

    // NCNN_LOGE("unpack_output_tile_int32_to_fp32  %d %d %d %d   @%d", i, max_ii, j, max_jj, out_elempack);

    const int* pp = topT;

    int ii = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; ii + 15 < max_ii; ii += 16)
    {
        int* p0 = (int*)top_blob + (i + ii) * out_hstep + j * out_elempack;

        int jj = 0;
#if defined(__x86_64__) || defined(_M_X64)
        for (; jj + 15 < max_jj; jj += 16)
        {
            __m512i _f0 = _mm512_load_si512((const __m512i*)pp);
            __m512i _f1 = _mm512_load_si512((const __m512i*)(pp + 16));
            __m512i _f2 = _mm512_load_si512((const __m512i*)(pp + 32));
            __m512i _f3 = _mm512_load_si512((const __m512i*)(pp + 48));
            __m512i _f4 = _mm512_load_si512((const __m512i*)(pp + 64));
            __m512i _f5 = _mm512_load_si512((const __m512i*)(pp + 80));
            __m512i _f6 = _mm512_load_si512((const __m512i*)(pp + 96));
            __m512i _f7 = _mm512_load_si512((const __m512i*)(pp + 112));
            __m512i _f8 = _mm512_load_si512((const __m512i*)(pp + 128));
            __m512i _f9 = _mm512_load_si512((const __m512i*)(pp + 128 + 16));
            __m512i _fa = _mm512_load_si512((const __m512i*)(pp + 128 + 32));
            __m512i _fb = _mm512_load_si512((const __m512i*)(pp + 128 + 48));
            __m512i _fc = _mm512_load_si512((const __m512i*)(pp + 128 + 64));
            __m512i _fd = _mm512_load_si512((const __m512i*)(pp + 128 + 80));
            __m512i _fe = _mm512_load_si512((const __m512i*)(pp + 128 + 96));
            __m512i _ff = _mm512_load_si512((const __m512i*)(pp + 128 + 112));
            pp += 256;

            // from
            // 00 11 22 33 44 55 66 77 88 99 aa bb cc dd ee ff
            // 01 12 23 30 45 56 67 74 89 9a ab b8 cd de ef fc
            // 20 31 02 13 64 75 46 57 a8 b9 8a 9b ec fd ce df
            // 21 32 03 10 65 76 47 54 a9 ba 8b 98 ed fe cf dc
            // 08 19 2a 3b 4c 5d 6e 7f 80 91 a2 b3 c4 d5 e6 f7
            // 09 1a 2b 38 4d 5e 6f 7c 81 92 a3 b0 c5 d6 e7 f4
            // 28 39 0a 1b 6c 7d 4e 5f a0 b1 82 93 e4 f5 c6 d7
            // 29 3a 0b 18 6d 7e 4f 5c a1 b2 83 90 e5 f6 c7 d4
            // 40 51 62 73 04 15 26 37 c8 d9 ea fb 8c 9d ae bf
            // 41 52 63 70 05 16 27 34 c9 da eb f8 8d 9e af bc
            // 60 71 42 53 24 35 06 17 e8 f9 ca db ac bd 8e 9f
            // 61 72 43 50 25 36 07 14 e9 fa cb d8 ad be 8f 9c
            // 48 59 6a 7b 0c 1d 2e 3f c0 d1 e2 f3 84 95 a6 b7
            // 49 5a 6b 78 0d 1e 2f 3c c1 d2 e3 f0 85 96 a7 b4
            // 68 79 4a 5b 2c 3d 0e 1f e0 f1 c2 d3 a4 b5 86 97
            // 69 7a 4b 58 2d 3e 0f 1c e1 f2 c3 d0 a5 b6 87 94

            // to
            // 00 10 20 30  40 50 60 70  80 90 a0 b0  c0 d0 e0 f0
            // 01 11 21 31  41 51 61 71  81 91 a1 b1  c1 d1 e1 f1
            // 02 12 22 32  42 52 62 72  82 92 a2 b2  c2 d2 e2 f2
            // 03 13 23 33  43 53 63 73  83 93 a3 b3  c3 d3 e3 f3
            // 04 14 24 34  44 54 64 74  84 94 a4 b4  c4 d4 e4 f4
            // 05 15 25 35  45 55 65 75  85 95 a5 b5  c5 d5 e5 f5
            // 06 16 26 36  46 56 66 76  86 96 a6 b6  c6 d6 e6 f6
            // 07 17 27 37  47 57 67 77  87 97 a7 b7  c7 d7 e7 f7
            // 08 18 28 38  48 58 68 78  88 98 a8 b8  c8 d8 e8 f8
            // 09 19 29 39  49 59 69 79  89 99 a9 b9  c9 d9 e9 f9
            // 0a 1a 2a 3a  4a 5a 6a 7a  8a 9a aa ba  ca da ea fa
            // 0b 1b 2b 3b  4b 5b 6b 7b  8b 9b ab bb  cb db eb fb
            // 0c 1c 2c 3c  4c 5c 6c 7c  8c 9c ac bc  cc dc ec fc
            // 0d 1d 2d 3d  4d 5d 6d 7d  8d 9d ad bd  cd dd ed fd
            // 0e 1e 2e 3e  4e 5e 6e 7e  8e 9e ae be  ce de ee fe
            // 0f 1f 2f 3f  4f 5f 6f 7f  8f 9f af bf  cf df ef ff
            {
                _f1 = _mm512_shuffle_epi32(_f1, _MM_PERM_CBAD);
                _f3 = _mm512_shuffle_epi32(_f3, _MM_PERM_CBAD);
                _f5 = _mm512_shuffle_epi32(_f5, _MM_PERM_CBAD);
                _f7 = _mm512_shuffle_epi32(_f7, _MM_PERM_CBAD);
                _f9 = _mm512_shuffle_epi32(_f9, _MM_PERM_CBAD);
                _fb = _mm512_shuffle_epi32(_fb, _MM_PERM_CBAD);
                _fd = _mm512_shuffle_epi32(_fd, _MM_PERM_CBAD);
                _ff = _mm512_shuffle_epi32(_ff, _MM_PERM_CBAD);

                __m512i _tmp0 = _mm512_unpacklo_epi32(_f0, _f3);
                __m512i _tmp1 = _mm512_unpackhi_epi32(_f0, _f3);
                __m512i _tmp2 = _mm512_unpacklo_epi32(_f2, _f1);
                __m512i _tmp3 = _mm512_unpackhi_epi32(_f2, _f1);
                __m512i _tmp4 = _mm512_unpacklo_epi32(_f4, _f7);
                __m512i _tmp5 = _mm512_unpackhi_epi32(_f4, _f7);
                __m512i _tmp6 = _mm512_unpacklo_epi32(_f6, _f5);
                __m512i _tmp7 = _mm512_unpackhi_epi32(_f6, _f5);
                __m512i _tmp8 = _mm512_unpacklo_epi32(_f8, _fb);
                __m512i _tmp9 = _mm512_unpackhi_epi32(_f8, _fb);
                __m512i _tmpa = _mm512_unpacklo_epi32(_fa, _f9);
                __m512i _tmpb = _mm512_unpackhi_epi32(_fa, _f9);
                __m512i _tmpc = _mm512_unpacklo_epi32(_fc, _ff);
                __m512i _tmpd = _mm512_unpackhi_epi32(_fc, _ff);
                __m512i _tmpe = _mm512_unpacklo_epi32(_fe, _fd);
                __m512i _tmpf = _mm512_unpackhi_epi32(_fe, _fd);

                _f0 = _mm512_unpacklo_epi64(_tmp0, _tmp2);
                _f1 = _mm512_unpackhi_epi64(_tmp0, _tmp2);
                _f2 = _mm512_unpacklo_epi64(_tmp3, _tmp1);
                _f3 = _mm512_unpackhi_epi64(_tmp3, _tmp1);
                _f4 = _mm512_unpacklo_epi64(_tmp4, _tmp6);
                _f5 = _mm512_unpackhi_epi64(_tmp4, _tmp6);
                _f6 = _mm512_unpacklo_epi64(_tmp7, _tmp5);
                _f7 = _mm512_unpackhi_epi64(_tmp7, _tmp5);
                _f8 = _mm512_unpacklo_epi64(_tmp8, _tmpa);
                _f9 = _mm512_unpackhi_epi64(_tmp8, _tmpa);
                _fa = _mm512_unpacklo_epi64(_tmpb, _tmp9);
                _fb = _mm512_unpackhi_epi64(_tmpb, _tmp9);
                _fc = _mm512_unpacklo_epi64(_tmpc, _tmpe);
                _fd = _mm512_unpackhi_epi64(_tmpc, _tmpe);
                _fe = _mm512_unpacklo_epi64(_tmpf, _tmpd);
                _ff = _mm512_unpackhi_epi64(_tmpf, _tmpd);

                _f1 = _mm512_shuffle_epi32(_f1, _MM_PERM_CBAD);
                _f3 = _mm512_shuffle_epi32(_f3, _MM_PERM_CBAD);
                _f5 = _mm512_shuffle_epi32(_f5, _MM_PERM_CBAD);
                _f7 = _mm512_shuffle_epi32(_f7, _MM_PERM_CBAD);
                _f9 = _mm512_shuffle_epi32(_f9, _MM_PERM_CBAD);
                _fb = _mm512_shuffle_epi32(_fb, _MM_PERM_CBAD);
                _fd = _mm512_shuffle_epi32(_fd, _MM_PERM_CBAD);
                _ff = _mm512_shuffle_epi32(_ff, _MM_PERM_CBAD);

                _tmp0 = _mm512_shuffle_i32x4(_f0, _f8, _MM_SHUFFLE(2, 0, 2, 0));
                _tmp1 = _mm512_shuffle_i32x4(_f1, _f9, _MM_SHUFFLE(2, 0, 2, 0));
                _tmp2 = _mm512_shuffle_i32x4(_f2, _fa, _MM_SHUFFLE(2, 0, 2, 0));
                _tmp3 = _mm512_shuffle_i32x4(_f3, _fb, _MM_SHUFFLE(2, 0, 2, 0));
                _tmp4 = _mm512_shuffle_i32x4(_f8, _f0, _MM_SHUFFLE(3, 1, 3, 1));
                _tmp5 = _mm512_shuffle_i32x4(_f9, _f1, _MM_SHUFFLE(3, 1, 3, 1));
                _tmp6 = _mm512_shuffle_i32x4(_fa, _f2, _MM_SHUFFLE(3, 1, 3, 1));
                _tmp7 = _mm512_shuffle_i32x4(_fb, _f3, _MM_SHUFFLE(3, 1, 3, 1));
                _tmp8 = _mm512_shuffle_i32x4(_f4, _fc, _MM_SHUFFLE(2, 0, 2, 0));
                _tmp9 = _mm512_shuffle_i32x4(_f5, _fd, _MM_SHUFFLE(2, 0, 2, 0));
                _tmpa = _mm512_shuffle_i32x4(_f6, _fe, _MM_SHUFFLE(2, 0, 2, 0));
                _tmpb = _mm512_shuffle_i32x4(_f7, _ff, _MM_SHUFFLE(2, 0, 2, 0));
                _tmpc = _mm512_shuffle_i32x4(_fc, _f4, _MM_SHUFFLE(3, 1, 3, 1));
                _tmpd = _mm512_shuffle_i32x4(_fd, _f5, _MM_SHUFFLE(3, 1, 3, 1));
                _tmpe = _mm512_shuffle_i32x4(_fe, _f6, _MM_SHUFFLE(3, 1, 3, 1));
                _tmpf = _mm512_shuffle_i32x4(_ff, _f7, _MM_SHUFFLE(3, 1, 3, 1));

                _f0 = _mm512_shuffle_i32x4(_tmp0, _tmp8, _MM_SHUFFLE(3, 1, 2, 0));
                _f1 = _mm512_shuffle_i32x4(_tmp1, _tmp9, _MM_SHUFFLE(3, 1, 2, 0));
                _f2 = _mm512_shuffle_i32x4(_tmp2, _tmpa, _MM_SHUFFLE(3, 1, 2, 0));
                _f3 = _mm512_shuffle_i32x4(_tmp3, _tmpb, _MM_SHUFFLE(3, 1, 2, 0));
                _f4 = _mm512_shuffle_i32x4(_tmp4, _tmpc, _MM_SHUFFLE(3, 1, 2, 0));
                _f5 = _mm512_shuffle_i32x4(_tmp5, _tmpd, _MM_SHUFFLE(3, 1, 2, 0));
                _f6 = _mm512_shuffle_i32x4(_tmp6, _tmpe, _MM_SHUFFLE(3, 1, 2, 0));
                _f7 = _mm512_shuffle_i32x4(_tmp7, _tmpf, _MM_SHUFFLE(3, 1, 2, 0));
                _f8 = _mm512_shuffle_i32x4(_tmp8, _tmp0, _MM_SHUFFLE(3, 1, 2, 0));
                _f9 = _mm512_shuffle_i32x4(_tmp9, _tmp1, _MM_SHUFFLE(3, 1, 2, 0));
                _fa = _mm512_shuffle_i32x4(_tmpa, _tmp2, _MM_SHUFFLE(3, 1, 2, 0));
                _fb = _mm512_shuffle_i32x4(_tmpb, _tmp3, _MM_SHUFFLE(3, 1, 2, 0));
                _fc = _mm512_shuffle_i32x4(_tmpc, _tmp4, _MM_SHUFFLE(3, 1, 2, 0));
                _fd = _mm512_shuffle_i32x4(_tmpd, _tmp5, _MM_SHUFFLE(3, 1, 2, 0));
                _fe = _mm512_shuffle_i32x4(_tmpe, _tmp6, _MM_SHUFFLE(3, 1, 2, 0));
                _ff = _mm512_shuffle_i32x4(_tmpf, _tmp7, _MM_SHUFFLE(3, 1, 2, 0));
            }

            {
                if (out_elempack == 16)
                {
                    _mm512_store_si512((__m512i*)p0, _f0);
                    _mm512_store_si512((__m512i*)(p0 + 16), _f1);
                    _mm512_store_si512((__m512i*)(p0 + 32), _f2);
                    _mm512_store_si512((__m512i*)(p0 + 48), _f3);
                    _mm512_store_si512((__m512i*)(p0 + 64), _f4);
                    _mm512_store_si512((__m512i*)(p0 + 80), _f5);
                    _mm512_store_si512((__m512i*)(p0 + 96), _f6);
                    _mm512_store_si512((__m512i*)(p0 + 112), _f7);
                    _mm512_store_si512((__m512i*)(p0 + 128), _f8);
                    _mm512_store_si512((__m512i*)(p0 + 128 + 16), _f9);
                    _mm512_store_si512((__m512i*)(p0 + 128 + 32), _fa);
                    _mm512_store_si512((__m512i*)(p0 + 128 + 48), _fb);
                    _mm512_store_si512((__m512i*)(p0 + 128 + 64), _fc);
                    _mm512_store_si512((__m512i*)(p0 + 128 + 80), _fd);
                    _mm512_store_si512((__m512i*)(p0 + 128 + 96), _fe);
                    _mm512_store_si512((__m512i*)(p0 + 128 + 112), _ff);
                    p0 += 256;
                }
                if (out_elempack == 8)
                {
                    _mm256_store_si256((__m256i*)p0, _mm512_extracti32x8_epi32(_f0, 0));
                    _mm256_store_si256((__m256i*)(p0 + 8), _mm512_extracti32x8_epi32(_f1, 0));
                    _mm256_store_si256((__m256i*)(p0 + 16), _mm512_extracti32x8_epi32(_f2, 0));
                    _mm256_store_si256((__m256i*)(p0 + 24), _mm512_extracti32x8_epi32(_f3, 0));
                    _mm256_store_si256((__m256i*)(p0 + 32), _mm512_extracti32x8_epi32(_f4, 0));
                    _mm256_store_si256((__m256i*)(p0 + 40), _mm512_extracti32x8_epi32(_f5, 0));
                    _mm256_store_si256((__m256i*)(p0 + 48), _mm512_extracti32x8_epi32(_f6, 0));
                    _mm256_store_si256((__m256i*)(p0 + 56), _mm512_extracti32x8_epi32(_f7, 0));
                    _mm256_store_si256((__m256i*)(p0 + 64), _mm512_extracti32x8_epi32(_f8, 0));
                    _mm256_store_si256((__m256i*)(p0 + 64 + 8), _mm512_extracti32x8_epi32(_f9, 0));
                    _mm256_store_si256((__m256i*)(p0 + 64 + 16), _mm512_extracti32x8_epi32(_fa, 0));
                    _mm256_store_si256((__m256i*)(p0 + 64 + 24), _mm512_extracti32x8_epi32(_fb, 0));
                    _mm256_store_si256((__m256i*)(p0 + 64 + 32), _mm512_extracti32x8_epi32(_fc, 0));
                    _mm256_store_si256((__m256i*)(p0 + 64 + 40), _mm512_extracti32x8_epi32(_fd, 0));
                    _mm256_store_si256((__m256i*)(p0 + 64 + 48), _mm512_extracti32x8_epi32(_fe, 0));
                    _mm256_store_si256((__m256i*)(p0 + 64 + 56), _mm512_extracti32x8_epi32(_ff, 0));
                    _mm256_store_si256((__m256i*)(p0 + out_hstep * 8), _mm512_extracti32x8_epi32(_f0, 1));
                    _mm256_store_si256((__m256i*)(p0 + out_hstep * 8 + 8), _mm512_extracti32x8_epi32(_f1, 1));
                    _mm256_store_si256((__m256i*)(p0 + out_hstep * 8 + 16), _mm512_extracti32x8_epi32(_f2, 1));
                    _mm256_store_si256((__m256i*)(p0 + out_hstep * 8 + 24), _mm512_extracti32x8_epi32(_f3, 1));
                    _mm256_store_si256((__m256i*)(p0 + out_hstep * 8 + 32), _mm512_extracti32x8_epi32(_f4, 1));
                    _mm256_store_si256((__m256i*)(p0 + out_hstep * 8 + 40), _mm512_extracti32x8_epi32(_f5, 1));
                    _mm256_store_si256((__m256i*)(p0 + out_hstep * 8 + 48), _mm512_extracti32x8_epi32(_f6, 1));
                    _mm256_store_si256((__m256i*)(p0 + out_hstep * 8 + 56), _mm512_extracti32x8_epi32(_f7, 1));
                    _mm256_store_si256((__m256i*)(p0 + out_hstep * 8 + 64), _mm512_extracti32x8_epi32(_f8, 1));
                    _mm256_store_si256((__m256i*)(p0 + out_hstep * 8 + 64 + 8), _mm512_extracti32x8_epi32(_f9, 1));
                    _mm256_store_si256((__m256i*)(p0 + out_hstep * 8 + 64 + 16), _mm512_extracti32x8_epi32(_fa, 1));
                    _mm256_store_si256((__m256i*)(p0 + out_hstep * 8 + 64 + 24), _mm512_extracti32x8_epi32(_fb, 1));
                    _mm256_store_si256((__m256i*)(p0 + out_hstep * 8 + 64 + 32), _mm512_extracti32x8_epi32(_fc, 1));
                    _mm256_store_si256((__m256i*)(p0 + out_hstep * 8 + 64 + 40), _mm512_extracti32x8_epi32(_fd, 1));
                    _mm256_store_si256((__m256i*)(p0 + out_hstep * 8 + 64 + 48), _mm512_extracti32x8_epi32(_fe, 1));
                    _mm256_store_si256((__m256i*)(p0 + out_hstep * 8 + 64 + 56), _mm512_extracti32x8_epi32(_ff, 1));
                    p0 += 128;
                }
                if (out_elempack == 4)
                {
                    __m512i _tmp0 = _mm512_shuffle_i32x4(_f0, _f1, _MM_SHUFFLE(2, 0, 2, 0));
                    __m512i _tmp1 = _mm512_shuffle_i32x4(_f2, _f3, _MM_SHUFFLE(2, 0, 2, 0));
                    __m512i _tmp2 = _mm512_shuffle_i32x4(_f4, _f5, _MM_SHUFFLE(2, 0, 2, 0));
                    __m512i _tmp3 = _mm512_shuffle_i32x4(_f6, _f7, _MM_SHUFFLE(2, 0, 2, 0));
                    __m512i _tmp4 = _mm512_shuffle_i32x4(_f8, _f9, _MM_SHUFFLE(2, 0, 2, 0));
                    __m512i _tmp5 = _mm512_shuffle_i32x4(_fa, _fb, _MM_SHUFFLE(2, 0, 2, 0));
                    __m512i _tmp6 = _mm512_shuffle_i32x4(_fc, _fd, _MM_SHUFFLE(2, 0, 2, 0));
                    __m512i _tmp7 = _mm512_shuffle_i32x4(_fe, _ff, _MM_SHUFFLE(2, 0, 2, 0));

                    __m512i _tmp8 = _mm512_shuffle_i32x4(_f0, _f1, _MM_SHUFFLE(3, 1, 3, 1));
                    __m512i _tmp9 = _mm512_shuffle_i32x4(_f2, _f3, _MM_SHUFFLE(3, 1, 3, 1));
                    __m512i _tmpa = _mm512_shuffle_i32x4(_f4, _f5, _MM_SHUFFLE(3, 1, 3, 1));
                    __m512i _tmpb = _mm512_shuffle_i32x4(_f6, _f7, _MM_SHUFFLE(3, 1, 3, 1));
                    __m512i _tmpc = _mm512_shuffle_i32x4(_f8, _f9, _MM_SHUFFLE(3, 1, 3, 1));
                    __m512i _tmpd = _mm512_shuffle_i32x4(_fa, _fb, _MM_SHUFFLE(3, 1, 3, 1));
                    __m512i _tmpe = _mm512_shuffle_i32x4(_fc, _fd, _MM_SHUFFLE(3, 1, 3, 1));
                    __m512i _tmpf = _mm512_shuffle_i32x4(_fe, _ff, _MM_SHUFFLE(3, 1, 3, 1));

                    _f0 = _mm512_shuffle_i32x4(_tmp0, _tmp1, _MM_SHUFFLE(2, 0, 2, 0));
                    _f1 = _mm512_shuffle_i32x4(_tmp2, _tmp3, _MM_SHUFFLE(2, 0, 2, 0));
                    _f2 = _mm512_shuffle_i32x4(_tmp4, _tmp5, _MM_SHUFFLE(2, 0, 2, 0));
                    _f3 = _mm512_shuffle_i32x4(_tmp6, _tmp7, _MM_SHUFFLE(2, 0, 2, 0));
                    _f4 = _mm512_shuffle_i32x4(_tmp8, _tmp9, _MM_SHUFFLE(2, 0, 2, 0));
                    _f5 = _mm512_shuffle_i32x4(_tmpa, _tmpb, _MM_SHUFFLE(2, 0, 2, 0));
                    _f6 = _mm512_shuffle_i32x4(_tmpc, _tmpd, _MM_SHUFFLE(2, 0, 2, 0));
                    _f7 = _mm512_shuffle_i32x4(_tmpe, _tmpf, _MM_SHUFFLE(2, 0, 2, 0));

                    _f8 = _mm512_shuffle_i32x4(_tmp0, _tmp1, _MM_SHUFFLE(3, 1, 3, 1));
                    _f9 = _mm512_shuffle_i32x4(_tmp2, _tmp3, _MM_SHUFFLE(3, 1, 3, 1));
                    _fa = _mm512_shuffle_i32x4(_tmp4, _tmp5, _MM_SHUFFLE(3, 1, 3, 1));
                    _fb = _mm512_shuffle_i32x4(_tmp6, _tmp7, _MM_SHUFFLE(3, 1, 3, 1));
                    _fc = _mm512_shuffle_i32x4(_tmp8, _tmp9, _MM_SHUFFLE(3, 1, 3, 1));
                    _fd = _mm512_shuffle_i32x4(_tmpa, _tmpb, _MM_SHUFFLE(3, 1, 3, 1));
                    _fe = _mm512_shuffle_i32x4(_tmpc, _tmpd, _MM_SHUFFLE(3, 1, 3, 1));
                    _ff = _mm512_shuffle_i32x4(_tmpe, _tmpf, _MM_SHUFFLE(3, 1, 3, 1));

                    _mm512_storeu_si512((__m512i*)p0, _f0);
                    _mm512_storeu_si512((__m512i*)(p0 + 16), _f1);
                    _mm512_storeu_si512((__m512i*)(p0 + 32), _f2);
                    _mm512_storeu_si512((__m512i*)(p0 + 48), _f3);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 4), _f4);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 4 + 16), _f5);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 4 + 32), _f6);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 4 + 48), _f7);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 8), _f8);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 8 + 16), _f9);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 8 + 32), _fa);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 8 + 48), _fb);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 12), _fc);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 12 + 16), _fd);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 12 + 32), _fe);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 12 + 48), _ff);
                    p0 += 64;
                }
                if (out_elempack == 1)
                {
                    transpose16x16_epi32(_f0, _f1, _f2, _f3, _f4, _f5, _f6, _f7, _f8, _f9, _fa, _fb, _fc, _fd, _fe, _ff);

                    _mm512_storeu_si512((__m512i*)p0, _f0);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep), _f1);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 2), _f2);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 3), _f3);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 4), _f4);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 5), _f5);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 6), _f6);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 7), _f7);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 8), _f8);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 9), _f9);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 10), _fa);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 11), _fb);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 12), _fc);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 13), _fd);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 14), _fe);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 15), _ff);
                    p0 += 16;
                }
            }
        }
        for (; jj + 7 < max_jj; jj += 8)
        {
            __m512i _f0 = _mm512_load_si512((const __m512i*)pp);
            __m512i _f1 = _mm512_load_si512((const __m512i*)(pp + 16));
            __m512i _f2 = _mm512_load_si512((const __m512i*)(pp + 32));
            __m512i _f3 = _mm512_load_si512((const __m512i*)(pp + 48));
            __m512i _f4 = _mm512_load_si512((const __m512i*)(pp + 64));
            __m512i _f5 = _mm512_load_si512((const __m512i*)(pp + 80));
            __m512i _f6 = _mm512_load_si512((const __m512i*)(pp + 96));
            __m512i _f7 = _mm512_load_si512((const __m512i*)(pp + 112));
            pp += 128;

            // from
            //      00 11 22 33  44 55 66 77  80 91 a2 b3  c4 d5 e6 f7
            //      01 12 23 30  45 56 67 74  81 92 a3 b0  c5 d6 e7 f4
            //      20 31 02 13  64 75 46 57  a0 b1 82 93  e4 f5 c6 d7
            //      21 32 03 10  65 76 47 54  a1 b2 83 90  e5 f6 c7 d4
            //      04 15 26 37  40 51 62 73  84 95 a6 b7  c0 d1 e2 f3
            //      05 16 27 34  41 52 63 70  85 96 a7 b4  c1 d2 e3 f0
            //      24 35 06 17  60 71 42 53  a4 b5 86 97  e0 f1 c2 d3
            //      25 36 07 14  61 72 43 50  a5 b6 87 94  e1 f2 c3 d0
            //
            // to
            //      00 10 20 30 40 50 60 70 80 90 a0 b0 c0 d0 e0 f0
            //      01 11 21 31 41 51 61 71 81 91 a1 b1 c1 d1 e1 f1
            //      02 12 22 32 42 52 62 72 82 92 a2 b2 c2 d2 e2 f2
            //      03 13 23 33 43 53 63 73 83 93 a3 b3 c3 d3 e3 f3
            //      04 14 24 34 44 54 64 74 84 94 a4 b4 c4 d4 e4 f4
            //      05 15 25 35 45 55 65 75 85 95 a5 b5 c5 d5 e5 f5
            //      06 16 26 36 46 56 66 76 86 96 a6 b6 c6 d6 e6 f6
            //      07 17 27 37 47 57 67 77 87 97 a7 b7 c7 d7 e7 f7
            {
                _f1 = _mm512_shuffle_epi32(_f1, _MM_PERM_CBAD);
                _f3 = _mm512_shuffle_epi32(_f3, _MM_PERM_CBAD);
                _f5 = _mm512_shuffle_epi32(_f5, _MM_PERM_CBAD);
                _f7 = _mm512_shuffle_epi32(_f7, _MM_PERM_CBAD);

                __m512i _tmp0 = _mm512_unpacklo_epi32(_f0, _f3);
                __m512i _tmp1 = _mm512_unpackhi_epi32(_f0, _f3);
                __m512i _tmp2 = _mm512_unpacklo_epi32(_f2, _f1);
                __m512i _tmp3 = _mm512_unpackhi_epi32(_f2, _f1);
                __m512i _tmp4 = _mm512_unpacklo_epi32(_f4, _f7);
                __m512i _tmp5 = _mm512_unpackhi_epi32(_f4, _f7);
                __m512i _tmp6 = _mm512_unpacklo_epi32(_f6, _f5);
                __m512i _tmp7 = _mm512_unpackhi_epi32(_f6, _f5);

                _f0 = _mm512_unpacklo_epi64(_tmp0, _tmp2);
                _f1 = _mm512_unpackhi_epi64(_tmp0, _tmp2);
                _f2 = _mm512_unpacklo_epi64(_tmp3, _tmp1);
                _f3 = _mm512_unpackhi_epi64(_tmp3, _tmp1);
                _f4 = _mm512_unpacklo_epi64(_tmp4, _tmp6);
                _f5 = _mm512_unpackhi_epi64(_tmp4, _tmp6);
                _f6 = _mm512_unpacklo_epi64(_tmp7, _tmp5);
                _f7 = _mm512_unpackhi_epi64(_tmp7, _tmp5);

                _f1 = _mm512_shuffle_epi32(_f1, _MM_PERM_CBAD);
                _f3 = _mm512_shuffle_epi32(_f3, _MM_PERM_CBAD);
                _f5 = _mm512_shuffle_epi32(_f5, _MM_PERM_CBAD);
                _f7 = _mm512_shuffle_epi32(_f7, _MM_PERM_CBAD);

                _tmp0 = _mm512_shuffle_i32x4(_f0, _f4, _MM_SHUFFLE(0, 1, 1, 0));
                _tmp1 = _mm512_shuffle_i32x4(_f1, _f5, _MM_SHUFFLE(0, 1, 1, 0));
                _tmp2 = _mm512_shuffle_i32x4(_f2, _f6, _MM_SHUFFLE(0, 1, 1, 0));
                _tmp3 = _mm512_shuffle_i32x4(_f3, _f7, _MM_SHUFFLE(0, 1, 1, 0));
                _tmp4 = _mm512_shuffle_i32x4(_f0, _f4, _MM_SHUFFLE(2, 3, 3, 2));
                _tmp5 = _mm512_shuffle_i32x4(_f1, _f5, _MM_SHUFFLE(2, 3, 3, 2));
                _tmp6 = _mm512_shuffle_i32x4(_f2, _f6, _MM_SHUFFLE(2, 3, 3, 2));
                _tmp7 = _mm512_shuffle_i32x4(_f3, _f7, _MM_SHUFFLE(2, 3, 3, 2));

                _f0 = _mm512_shuffle_i32x4(_tmp0, _tmp4, _MM_SHUFFLE(2, 0, 2, 0));
                _f1 = _mm512_shuffle_i32x4(_tmp1, _tmp5, _MM_SHUFFLE(2, 0, 2, 0));
                _f2 = _mm512_shuffle_i32x4(_tmp2, _tmp6, _MM_SHUFFLE(2, 0, 2, 0));
                _f3 = _mm512_shuffle_i32x4(_tmp3, _tmp7, _MM_SHUFFLE(2, 0, 2, 0));
                _f4 = _mm512_shuffle_i32x4(_tmp0, _tmp4, _MM_SHUFFLE(1, 3, 1, 3));
                _f5 = _mm512_shuffle_i32x4(_tmp1, _tmp5, _MM_SHUFFLE(1, 3, 1, 3));
                _f6 = _mm512_shuffle_i32x4(_tmp2, _tmp6, _MM_SHUFFLE(1, 3, 1, 3));
                _f7 = _mm512_shuffle_i32x4(_tmp3, _tmp7, _MM_SHUFFLE(1, 3, 1, 3));
            }

            {
                if (out_elempack == 16)
                {
                    _mm512_store_si512((__m512i*)p0, _f0);
                    _mm512_store_si512((__m512i*)(p0 + 16), _f1);
                    _mm512_store_si512((__m512i*)(p0 + 32), _f2);
                    _mm512_store_si512((__m512i*)(p0 + 48), _f3);
                    _mm512_store_si512((__m512i*)(p0 + 64), _f4);
                    _mm512_store_si512((__m512i*)(p0 + 80), _f5);
                    _mm512_store_si512((__m512i*)(p0 + 96), _f6);
                    _mm512_store_si512((__m512i*)(p0 + 112), _f7);
                    p0 += 128;
                }
                if (out_elempack == 8)
                {
                    _mm256_store_si256((__m256i*)p0, _mm512_extracti32x8_epi32(_f0, 0));
                    _mm256_store_si256((__m256i*)(p0 + 8), _mm512_extracti32x8_epi32(_f1, 0));
                    _mm256_store_si256((__m256i*)(p0 + 16), _mm512_extracti32x8_epi32(_f2, 0));
                    _mm256_store_si256((__m256i*)(p0 + 24), _mm512_extracti32x8_epi32(_f3, 0));
                    _mm256_store_si256((__m256i*)(p0 + 32), _mm512_extracti32x8_epi32(_f4, 0));
                    _mm256_store_si256((__m256i*)(p0 + 40), _mm512_extracti32x8_epi32(_f5, 0));
                    _mm256_store_si256((__m256i*)(p0 + 48), _mm512_extracti32x8_epi32(_f6, 0));
                    _mm256_store_si256((__m256i*)(p0 + 56), _mm512_extracti32x8_epi32(_f7, 0));
                    _mm256_store_si256((__m256i*)(p0 + out_hstep * 8), _mm512_extracti32x8_epi32(_f0, 1));
                    _mm256_store_si256((__m256i*)(p0 + out_hstep * 8 + 8), _mm512_extracti32x8_epi32(_f1, 1));
                    _mm256_store_si256((__m256i*)(p0 + out_hstep * 8 + 16), _mm512_extracti32x8_epi32(_f2, 1));
                    _mm256_store_si256((__m256i*)(p0 + out_hstep * 8 + 24), _mm512_extracti32x8_epi32(_f3, 1));
                    _mm256_store_si256((__m256i*)(p0 + out_hstep * 8 + 32), _mm512_extracti32x8_epi32(_f4, 1));
                    _mm256_store_si256((__m256i*)(p0 + out_hstep * 8 + 40), _mm512_extracti32x8_epi32(_f5, 1));
                    _mm256_store_si256((__m256i*)(p0 + out_hstep * 8 + 48), _mm512_extracti32x8_epi32(_f6, 1));
                    _mm256_store_si256((__m256i*)(p0 + out_hstep * 8 + 56), _mm512_extracti32x8_epi32(_f7, 1));
                    p0 += 64;
                }
                if (out_elempack == 4)
                {
                    __m512i _tmp0 = _mm512_shuffle_i32x4(_f0, _f1, _MM_SHUFFLE(2, 0, 2, 0));
                    __m512i _tmp1 = _mm512_shuffle_i32x4(_f2, _f3, _MM_SHUFFLE(2, 0, 2, 0));
                    __m512i _tmp2 = _mm512_shuffle_i32x4(_f4, _f5, _MM_SHUFFLE(2, 0, 2, 0));
                    __m512i _tmp3 = _mm512_shuffle_i32x4(_f6, _f7, _MM_SHUFFLE(2, 0, 2, 0));
                    __m512i _tmp4 = _mm512_shuffle_i32x4(_f0, _f1, _MM_SHUFFLE(3, 1, 3, 1));
                    __m512i _tmp5 = _mm512_shuffle_i32x4(_f2, _f3, _MM_SHUFFLE(3, 1, 3, 1));
                    __m512i _tmp6 = _mm512_shuffle_i32x4(_f4, _f5, _MM_SHUFFLE(3, 1, 3, 1));
                    __m512i _tmp7 = _mm512_shuffle_i32x4(_f6, _f7, _MM_SHUFFLE(3, 1, 3, 1));

                    _f0 = _mm512_shuffle_i32x4(_tmp0, _tmp1, _MM_SHUFFLE(2, 0, 2, 0));
                    _f1 = _mm512_shuffle_i32x4(_tmp2, _tmp3, _MM_SHUFFLE(2, 0, 2, 0));
                    _f2 = _mm512_shuffle_i32x4(_tmp4, _tmp5, _MM_SHUFFLE(2, 0, 2, 0));
                    _f3 = _mm512_shuffle_i32x4(_tmp6, _tmp7, _MM_SHUFFLE(2, 0, 2, 0));
                    _f4 = _mm512_shuffle_i32x4(_tmp0, _tmp1, _MM_SHUFFLE(3, 1, 3, 1));
                    _f5 = _mm512_shuffle_i32x4(_tmp2, _tmp3, _MM_SHUFFLE(3, 1, 3, 1));
                    _f6 = _mm512_shuffle_i32x4(_tmp4, _tmp5, _MM_SHUFFLE(3, 1, 3, 1));
                    _f7 = _mm512_shuffle_i32x4(_tmp6, _tmp7, _MM_SHUFFLE(3, 1, 3, 1));

                    _mm512_storeu_si512((__m512i*)p0, _f0);
                    _mm512_storeu_si512((__m512i*)(p0 + 16), _f1);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 4), _f2);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 4 + 16), _f3);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 8), _f4);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 8 + 16), _f5);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 12), _f6);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 12 + 16), _f7);
                    p0 += 32;
                }
                if (out_elempack == 1)
                {
                    transpose16x8_epi32(_f0, _f1, _f2, _f3, _f4, _f5, _f6, _f7);
                    _mm256_storeu_si256((__m256i*)p0, _mm512_extracti32x8_epi32(_f0, 0));
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep), _mm512_extracti32x8_epi32(_f0, 1));
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 2), _mm512_extracti32x8_epi32(_f1, 0));
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 3), _mm512_extracti32x8_epi32(_f1, 1));
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 4), _mm512_extracti32x8_epi32(_f2, 0));
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 5), _mm512_extracti32x8_epi32(_f2, 1));
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 6), _mm512_extracti32x8_epi32(_f3, 0));
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 7), _mm512_extracti32x8_epi32(_f3, 1));
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 8), _mm512_extracti32x8_epi32(_f4, 0));
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 9), _mm512_extracti32x8_epi32(_f4, 1));
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 10), _mm512_extracti32x8_epi32(_f5, 0));
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 11), _mm512_extracti32x8_epi32(_f5, 1));
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 12), _mm512_extracti32x8_epi32(_f6, 0));
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 13), _mm512_extracti32x8_epi32(_f6, 1));
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 14), _mm512_extracti32x8_epi32(_f7, 0));
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 15), _mm512_extracti32x8_epi32(_f7, 1));
                    p0 += 8;
                }
            }
        }
#endif // defined(__x86_64__) || defined(_M_X64)
        for (; jj + 3 < max_jj; jj += 4)
        {
            __m512i _f0 = _mm512_load_si512((const __m512i*)pp);
            __m512i _f1 = _mm512_load_si512((const __m512i*)(pp + 16));
            __m512i _f2 = _mm512_load_si512((const __m512i*)(pp + 32));
            __m512i _f3 = _mm512_load_si512((const __m512i*)(pp + 48));
            pp += 64;

            // from
            //      00 11 22 33 40 51 62 73 80 91 a2 b3 c0 d1 e2 f3
            //      01 12 23 30 41 52 63 70 81 92 a3 b0 c1 d2 e3 f0
            //      20 31 02 13 60 71 42 53 a0 b1 82 93 e0 f1 c2 d3
            //      21 32 03 10 61 72 43 50 a1 b2 83 90 e1 f2 c3 d0
            // to
            //      00 10 20 30 40 50 60 70 80 90 a0 b0 c0 d0 e0 f0
            //      01 11 21 31 41 51 61 71 81 91 a1 b1 c1 d1 e1 f1
            //      02 12 22 32 42 52 62 72 82 92 a2 b2 c2 d2 e2 f2
            //      03 13 23 33 43 53 63 73 83 93 a3 b3 c3 d3 e3 f3
            {
                _f1 = _mm512_shuffle_epi32(_f1, _MM_PERM_CBAD);
                _f3 = _mm512_shuffle_epi32(_f3, _MM_PERM_CBAD);
                __m512i _tmp0 = _mm512_unpacklo_epi32(_f0, _f3);
                __m512i _tmp1 = _mm512_unpackhi_epi32(_f0, _f3);
                __m512i _tmp2 = _mm512_unpacklo_epi32(_f2, _f1);
                __m512i _tmp3 = _mm512_unpackhi_epi32(_f2, _f1);
                _f0 = _mm512_unpacklo_epi64(_tmp0, _tmp2);
                _f1 = _mm512_unpackhi_epi64(_tmp0, _tmp2);
                _f2 = _mm512_unpacklo_epi64(_tmp3, _tmp1);
                _f3 = _mm512_unpackhi_epi64(_tmp3, _tmp1);
                _f1 = _mm512_shuffle_epi32(_f1, _MM_PERM_CBAD);
                _f3 = _mm512_shuffle_epi32(_f3, _MM_PERM_CBAD);
            }

            {
                if (out_elempack == 16)
                {
                    _mm512_store_si512((__m512i*)p0, _f0);
                    _mm512_store_si512((__m512i*)(p0 + 16), _f1);
                    _mm512_store_si512((__m512i*)(p0 + 32), _f2);
                    _mm512_store_si512((__m512i*)(p0 + 48), _f3);
                    p0 += 64;
                }
                if (out_elempack == 8)
                {
                    __m512i _tmp0 = _mm512_shuffle_i32x4(_f0, _f1, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512i _tmp1 = _mm512_shuffle_i32x4(_f2, _f3, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512i _tmp2 = _mm512_shuffle_i32x4(_f0, _f1, _MM_SHUFFLE(3, 2, 3, 2));
                    __m512i _tmp3 = _mm512_shuffle_i32x4(_f2, _f3, _MM_SHUFFLE(3, 2, 3, 2));

                    _mm512_storeu_si512((__m512i*)p0, _tmp0);
                    _mm512_storeu_si512((__m512i*)(p0 + 16), _tmp1);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 8), _tmp2);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 8 + 16), _tmp3);
                    p0 += 32;
                }
                if (out_elempack == 4)
                {
                    __m512i _tmp0 = _mm512_shuffle_i32x4(_f0, _f1, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512i _tmp1 = _mm512_shuffle_i32x4(_f2, _f3, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512i _tmp2 = _mm512_shuffle_i32x4(_f0, _f1, _MM_SHUFFLE(3, 2, 3, 2));
                    __m512i _tmp3 = _mm512_shuffle_i32x4(_f2, _f3, _MM_SHUFFLE(3, 2, 3, 2));
                    _f0 = _mm512_shuffle_i32x4(_tmp0, _tmp1, _MM_SHUFFLE(2, 0, 2, 0));
                    _f1 = _mm512_shuffle_i32x4(_tmp0, _tmp1, _MM_SHUFFLE(3, 1, 3, 1));
                    _f2 = _mm512_shuffle_i32x4(_tmp2, _tmp3, _MM_SHUFFLE(2, 0, 2, 0));
                    _f3 = _mm512_shuffle_i32x4(_tmp2, _tmp3, _MM_SHUFFLE(3, 1, 3, 1));

                    _mm512_storeu_si512((__m512i*)p0, _f0);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 4), _f1);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 8), _f2);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 12), _f3);
                    p0 += 16;
                }
                if (out_elempack == 1)
                {
                    transpose16x4_epi32(_f0, _f1, _f2, _f3);

                    _mm_storeu_si128((__m128i*)p0, _mm512_extracti32x4_epi32(_f0, 0));
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep), _mm512_extracti32x4_epi32(_f0, 1));
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep * 2), _mm512_extracti32x4_epi32(_f0, 2));
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep * 3), _mm512_extracti32x4_epi32(_f0, 3));
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep * 4), _mm512_extracti32x4_epi32(_f1, 0));
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep * 5), _mm512_extracti32x4_epi32(_f1, 1));
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep * 6), _mm512_extracti32x4_epi32(_f1, 2));
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep * 7), _mm512_extracti32x4_epi32(_f1, 3));
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep * 8), _mm512_extracti32x4_epi32(_f2, 0));
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep * 9), _mm512_extracti32x4_epi32(_f2, 1));
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep * 10), _mm512_extracti32x4_epi32(_f2, 2));
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep * 11), _mm512_extracti32x4_epi32(_f2, 3));
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep * 12), _mm512_extracti32x4_epi32(_f3, 0));
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep * 13), _mm512_extracti32x4_epi32(_f3, 1));
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep * 14), _mm512_extracti32x4_epi32(_f3, 2));
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep * 15), _mm512_extracti32x4_epi32(_f3, 3));
                    p0 += 4;
                }
            }
        }
        for (; jj + 1 < max_jj; jj += 2)
        {
            __m512i _f0 = _mm512_load_si512((const __m512i*)pp);
            __m512i _f1 = _mm512_load_si512((const __m512i*)(pp + 16));
            pp += 32;

            // from
            //      00 11 20 31 40 51 60 71 80 91 a0 b1 c0 d1 e0 f1
            //      01 10 21 30 41 50 61 70 81 90 a1 b0 c1 d0 e1 f0
            // to
            //      00 10 20 30 40 50 60 70 80 90 a0 b0 c0 d0 e0 f0
            //      01 11 21 31 41 51 61 71 81 91 a1 b1 c1 d1 e1 f1
            {
                __m512i _tmp0 = _mm512_shuffle_epi32(_f0, _MM_PERM_DBCA);
                __m512i _tmp1 = _mm512_shuffle_epi32(_f1, _MM_PERM_ACDB);
                _f0 = _mm512_unpacklo_epi32(_tmp0, _tmp1);
                _f1 = _mm512_unpackhi_epi32(_tmp0, _tmp1);
                _f1 = _mm512_shuffle_epi32(_f1, _MM_PERM_CBAD);
            }

            {
                if (out_elempack == 16)
                {
                    _mm512_store_si512((__m512i*)p0, _f0);
                    _mm512_store_si512((__m512i*)(p0 + 16), _f1);
                    p0 += 32;
                }
                if (out_elempack == 8)
                {
                    __m512i _tmp0 = _mm512_shuffle_i32x4(_f0, _f1, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512i _tmp1 = _mm512_shuffle_i32x4(_f0, _f1, _MM_SHUFFLE(3, 2, 3, 2));
                    _mm512_storeu_si512((__m512i*)p0, _tmp0);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 8), _tmp1);
                    p0 += 16;
                }
                if (out_elempack == 4)
                {
                    _mm_store_si128((__m128i*)p0, _mm512_extracti32x4_epi32(_f0, 0));
                    _mm_store_si128((__m128i*)(p0 + 4), _mm512_extracti32x4_epi32(_f1, 0));
                    _mm_store_si128((__m128i*)(p0 + out_hstep * 4), _mm512_extracti32x4_epi32(_f0, 1));
                    _mm_store_si128((__m128i*)(p0 + out_hstep * 4 + 4), _mm512_extracti32x4_epi32(_f1, 1));
                    _mm_store_si128((__m128i*)(p0 + out_hstep * 8), _mm512_extracti32x4_epi32(_f0, 2));
                    _mm_store_si128((__m128i*)(p0 + out_hstep * 8 + 4), _mm512_extracti32x4_epi32(_f1, 2));
                    _mm_store_si128((__m128i*)(p0 + out_hstep * 12), _mm512_extracti32x4_epi32(_f0, 3));
                    _mm_store_si128((__m128i*)(p0 + out_hstep * 12 + 4), _mm512_extracti32x4_epi32(_f1, 3));
                    p0 += 8;
                }
                if (out_elempack == 1)
                {
                    __m512i _vindex = _mm512_mullo_epi32(_mm512_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15), _mm512_set1_epi32(out_hstep));
                    _mm512_i32scatter_epi32(p0, _vindex, _f0, sizeof(int));
                    _mm512_i32scatter_epi32(p0 + 1, _vindex, _f1, sizeof(int));
                    p0 += 2;
                }
            }
        }
        for (; jj < max_jj; jj++)
        {
            __m512i _f0 = _mm512_load_si512((const __m512i*)pp);
            pp += 16;

            {
                if (out_elempack == 16)
                {
                    _mm512_store_si512((__m512i*)p0, _f0);
                    p0 += 16;
                }
                if (out_elempack == 8)
                {
                    _mm256_store_si256((__m256i*)p0, _mm512_extracti32x8_epi32(_f0, 0));
                    _mm256_store_si256((__m256i*)(p0 + out_hstep * 8), _mm512_extracti32x8_epi32(_f0, 1));
                    p0 += 8;
                }
                if (out_elempack == 4)
                {
                    _mm_store_si128((__m128i*)p0, _mm512_extracti32x4_epi32(_f0, 0));
                    _mm_store_si128((__m128i*)(p0 + out_hstep * 4), _mm512_extracti32x4_epi32(_f0, 1));
                    _mm_store_si128((__m128i*)(p0 + out_hstep * 8), _mm512_extracti32x4_epi32(_f0, 2));
                    _mm_store_si128((__m128i*)(p0 + out_hstep * 12), _mm512_extracti32x4_epi32(_f0, 3));
                    p0 += 4;
                }
                if (out_elempack == 1)
                {
                    __m512i _vindex = _mm512_mullo_epi32(_mm512_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15), _mm512_set1_epi32(out_hstep));
                    _mm512_i32scatter_epi32(p0, _vindex, _f0, sizeof(int));
                    p0++;
                }
            }
        }
    }
#endif // __AVX512F__
#if !__AVX2__
    const int* pp1 = pp + max_jj * 4;
#endif
    for (; ii + 7 < max_ii; ii += 8)
    {
        int* p0 = (int*)top_blob + (i + ii) * out_hstep + j * out_elempack;

        int jj = 0;
#if defined(__x86_64__) || defined(_M_X64)
#if __AVX512F__
        for (; jj + 15 < max_jj; jj += 16)
        {
            __m512i _f0 = _mm512_load_si512((const __m512i*)pp);
            __m512i _f1 = _mm512_load_si512((const __m512i*)(pp + 16));
            __m512i _f2 = _mm512_load_si512((const __m512i*)(pp + 32));
            __m512i _f3 = _mm512_load_si512((const __m512i*)(pp + 48));
            __m512i _f4 = _mm512_load_si512((const __m512i*)(pp + 64));
            __m512i _f5 = _mm512_load_si512((const __m512i*)(pp + 80));
            __m512i _f6 = _mm512_load_si512((const __m512i*)(pp + 96));
            __m512i _f7 = _mm512_load_si512((const __m512i*)(pp + 112));
            pp += 128;

            // from
            //      00 11 22 33  44 55 66 77  08 19 2a 3b  4c 5d 6e 7f
            //      01 12 23 30  45 56 67 74  09 1a 2b 38  4d 5e 6f 7c
            //      20 31 02 13  64 75 46 57  28 39 0a 1b  6c 7d 4e 5f
            //      21 32 03 10  65 76 47 54  29 3a 0b 18  6d 7e 4f 5c
            //      04 15 26 37  40 51 62 73  0c 1d 2e 3f  48 59 6a 7b
            //      05 16 27 34  41 52 63 70  0d 1e 2f 3c  49 5a 6b 78
            //      24 35 06 17  60 71 42 53  2c 3d 0e 1f  68 79 4a 5b
            //      25 36 07 14  61 72 43 50  2d 3e 0f 1c  69 7a 4b 58

            // to
            //      00 10 20 30  44 54 64 74  08 18 28 38  4c 5c 6c 7c
            //      01 11 21 31  45 55 65 75  09 19 29 39  4d 5d 6d 7d
            //      02 12 22 32  46 56 66 76  0a 1a 2a 3a  4e 5e 6e 7e
            //      03 13 23 33  47 57 67 77  0b 1b 2b 3b  4f 5f 6f 7f
            //      04 14 24 34  40 50 60 70  0c 1c 2c 3c  48 58 68 78
            //      05 15 25 35  41 51 61 71  0d 1d 2d 3d  49 59 69 79
            //      06 16 26 36  42 52 62 72  0e 1e 2e 3e  4a 5a 6a 7a
            //      07 17 27 37  43 53 63 73  0f 1f 2f 3f  4b 5b 6b 7b
            {
                _f1 = _mm512_shuffle_epi32(_f1, _MM_PERM_CBAD);
                _f3 = _mm512_shuffle_epi32(_f3, _MM_PERM_CBAD);
                _f5 = _mm512_shuffle_epi32(_f5, _MM_PERM_CBAD);
                _f7 = _mm512_shuffle_epi32(_f7, _MM_PERM_CBAD);

                __m512i _tmp0 = _mm512_unpacklo_epi32(_f0, _f3);
                __m512i _tmp1 = _mm512_unpackhi_epi32(_f0, _f3);
                __m512i _tmp2 = _mm512_unpacklo_epi32(_f2, _f1);
                __m512i _tmp3 = _mm512_unpackhi_epi32(_f2, _f1);
                __m512i _tmp4 = _mm512_unpacklo_epi32(_f4, _f7);
                __m512i _tmp5 = _mm512_unpackhi_epi32(_f4, _f7);
                __m512i _tmp6 = _mm512_unpacklo_epi32(_f6, _f5);
                __m512i _tmp7 = _mm512_unpackhi_epi32(_f6, _f5);

                _f0 = _mm512_unpacklo_epi64(_tmp0, _tmp2);
                _f1 = _mm512_unpackhi_epi64(_tmp0, _tmp2);
                _f2 = _mm512_unpacklo_epi64(_tmp3, _tmp1);
                _f3 = _mm512_unpackhi_epi64(_tmp3, _tmp1);
                _f4 = _mm512_unpacklo_epi64(_tmp4, _tmp6);
                _f5 = _mm512_unpackhi_epi64(_tmp4, _tmp6);
                _f6 = _mm512_unpacklo_epi64(_tmp7, _tmp5);
                _f7 = _mm512_unpackhi_epi64(_tmp7, _tmp5);

                _f1 = _mm512_shuffle_epi32(_f1, _MM_PERM_CBAD);
                _f3 = _mm512_shuffle_epi32(_f3, _MM_PERM_CBAD);
                _f5 = _mm512_shuffle_epi32(_f5, _MM_PERM_CBAD);
                _f7 = _mm512_shuffle_epi32(_f7, _MM_PERM_CBAD);

                _tmp0 = _mm512_shuffle_i32x4(_f0, _f4, _MM_SHUFFLE(0, 1, 1, 0));
                _tmp1 = _mm512_shuffle_i32x4(_f0, _f4, _MM_SHUFFLE(2, 3, 3, 2));
                _tmp2 = _mm512_shuffle_i32x4(_f1, _f5, _MM_SHUFFLE(0, 1, 1, 0));
                _tmp3 = _mm512_shuffle_i32x4(_f1, _f5, _MM_SHUFFLE(2, 3, 3, 2));
                _tmp4 = _mm512_shuffle_i32x4(_f2, _f6, _MM_SHUFFLE(0, 1, 1, 0));
                _tmp5 = _mm512_shuffle_i32x4(_f2, _f6, _MM_SHUFFLE(2, 3, 3, 2));
                _tmp6 = _mm512_shuffle_i32x4(_f3, _f7, _MM_SHUFFLE(0, 1, 1, 0));
                _tmp7 = _mm512_shuffle_i32x4(_f3, _f7, _MM_SHUFFLE(2, 3, 3, 2));

                _f0 = _mm512_shuffle_i32x4(_tmp0, _tmp1, _MM_SHUFFLE(2, 0, 2, 0));
                _f1 = _mm512_shuffle_i32x4(_tmp2, _tmp3, _MM_SHUFFLE(2, 0, 2, 0));
                _f2 = _mm512_shuffle_i32x4(_tmp4, _tmp5, _MM_SHUFFLE(2, 0, 2, 0));
                _f3 = _mm512_shuffle_i32x4(_tmp6, _tmp7, _MM_SHUFFLE(2, 0, 2, 0));
                _f4 = _mm512_shuffle_i32x4(_tmp0, _tmp1, _MM_SHUFFLE(1, 3, 1, 3));
                _f5 = _mm512_shuffle_i32x4(_tmp2, _tmp3, _MM_SHUFFLE(1, 3, 1, 3));
                _f6 = _mm512_shuffle_i32x4(_tmp4, _tmp5, _MM_SHUFFLE(1, 3, 1, 3));
                _f7 = _mm512_shuffle_i32x4(_tmp6, _tmp7, _MM_SHUFFLE(1, 3, 1, 3));
            }

            {
                if (out_elempack == 8)
                {
                    __m512i _tmp0 = _mm512_shuffle_i32x4(_f0, _f1, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512i _tmp1 = _mm512_shuffle_i32x4(_f2, _f3, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512i _tmp2 = _mm512_shuffle_i32x4(_f4, _f5, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512i _tmp3 = _mm512_shuffle_i32x4(_f6, _f7, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512i _tmp4 = _mm512_shuffle_i32x4(_f0, _f1, _MM_SHUFFLE(3, 2, 3, 2));
                    __m512i _tmp5 = _mm512_shuffle_i32x4(_f2, _f3, _MM_SHUFFLE(3, 2, 3, 2));
                    __m512i _tmp6 = _mm512_shuffle_i32x4(_f4, _f5, _MM_SHUFFLE(3, 2, 3, 2));
                    __m512i _tmp7 = _mm512_shuffle_i32x4(_f6, _f7, _MM_SHUFFLE(3, 2, 3, 2));

                    _mm512_storeu_si512((__m512i*)p0, _tmp0);
                    _mm512_storeu_si512((__m512i*)(p0 + 16), _tmp1);
                    _mm512_storeu_si512((__m512i*)(p0 + 32), _tmp2);
                    _mm512_storeu_si512((__m512i*)(p0 + 48), _tmp3);
                    _mm512_storeu_si512((__m512i*)(p0 + 64), _tmp4);
                    _mm512_storeu_si512((__m512i*)(p0 + 80), _tmp5);
                    _mm512_storeu_si512((__m512i*)(p0 + 96), _tmp6);
                    _mm512_storeu_si512((__m512i*)(p0 + 112), _tmp7);
                    p0 += 128;
                }
                if (out_elempack == 4)
                {
                    __m512i _tmp0 = _mm512_shuffle_i32x4(_f0, _f1, _MM_SHUFFLE(2, 0, 2, 0));
                    __m512i _tmp1 = _mm512_shuffle_i32x4(_f2, _f3, _MM_SHUFFLE(2, 0, 2, 0));
                    __m512i _tmp2 = _mm512_shuffle_i32x4(_f4, _f5, _MM_SHUFFLE(2, 0, 2, 0));
                    __m512i _tmp3 = _mm512_shuffle_i32x4(_f6, _f7, _MM_SHUFFLE(2, 0, 2, 0));
                    __m512i _tmp4 = _mm512_shuffle_i32x4(_f0, _f1, _MM_SHUFFLE(3, 1, 3, 1));
                    __m512i _tmp5 = _mm512_shuffle_i32x4(_f2, _f3, _MM_SHUFFLE(3, 1, 3, 1));
                    __m512i _tmp6 = _mm512_shuffle_i32x4(_f4, _f5, _MM_SHUFFLE(3, 1, 3, 1));
                    __m512i _tmp7 = _mm512_shuffle_i32x4(_f6, _f7, _MM_SHUFFLE(3, 1, 3, 1));

                    _f0 = _mm512_shuffle_i32x4(_tmp0, _tmp1, _MM_SHUFFLE(2, 0, 2, 0));
                    _f1 = _mm512_shuffle_i32x4(_tmp2, _tmp3, _MM_SHUFFLE(2, 0, 2, 0));
                    _f2 = _mm512_shuffle_i32x4(_tmp0, _tmp1, _MM_SHUFFLE(3, 1, 3, 1));
                    _f3 = _mm512_shuffle_i32x4(_tmp2, _tmp3, _MM_SHUFFLE(3, 1, 3, 1));
                    _f4 = _mm512_shuffle_i32x4(_tmp4, _tmp5, _MM_SHUFFLE(2, 0, 2, 0));
                    _f5 = _mm512_shuffle_i32x4(_tmp6, _tmp7, _MM_SHUFFLE(2, 0, 2, 0));
                    _f6 = _mm512_shuffle_i32x4(_tmp4, _tmp5, _MM_SHUFFLE(3, 1, 3, 1));
                    _f7 = _mm512_shuffle_i32x4(_tmp6, _tmp7, _MM_SHUFFLE(3, 1, 3, 1));

                    _mm512_storeu_si512((__m512i*)p0, _f0);
                    _mm512_storeu_si512((__m512i*)(p0 + 16), _f1);
                    _mm512_storeu_si512((__m512i*)(p0 + 32), _f2);
                    _mm512_storeu_si512((__m512i*)(p0 + 48), _f3);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 4), _f4);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 4 + 16), _f5);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 4 + 32), _f6);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 4 + 48), _f7);
                    p0 += 64;
                }
                if (out_elempack == 1)
                {
                    __m512i _tmp0 = _mm512_unpacklo_epi32(_f0, _f1);
                    __m512i _tmp1 = _mm512_unpacklo_epi32(_f2, _f3);
                    __m512i _tmp2 = _mm512_unpacklo_epi32(_f4, _f5);
                    __m512i _tmp3 = _mm512_unpacklo_epi32(_f6, _f7);
                    __m512i _tmp4 = _mm512_unpackhi_epi32(_f0, _f1);
                    __m512i _tmp5 = _mm512_unpackhi_epi32(_f2, _f3);
                    __m512i _tmp6 = _mm512_unpackhi_epi32(_f4, _f5);
                    __m512i _tmp7 = _mm512_unpackhi_epi32(_f6, _f7);

                    _f0 = _mm512_unpacklo_epi64(_tmp0, _tmp1);
                    _f1 = _mm512_unpacklo_epi64(_tmp2, _tmp3);
                    _f2 = _mm512_unpackhi_epi64(_tmp0, _tmp1);
                    _f3 = _mm512_unpackhi_epi64(_tmp2, _tmp3);
                    _f4 = _mm512_unpacklo_epi64(_tmp4, _tmp5);
                    _f5 = _mm512_unpacklo_epi64(_tmp6, _tmp7);
                    _f6 = _mm512_unpackhi_epi64(_tmp4, _tmp5);
                    _f7 = _mm512_unpackhi_epi64(_tmp6, _tmp7);

                    _tmp0 = _mm512_shuffle_i32x4(_f0, _f1, _MM_SHUFFLE(2, 0, 2, 0));
                    _tmp1 = _mm512_shuffle_i32x4(_f2, _f3, _MM_SHUFFLE(2, 0, 2, 0));
                    _tmp2 = _mm512_shuffle_i32x4(_f4, _f5, _MM_SHUFFLE(2, 0, 2, 0));
                    _tmp3 = _mm512_shuffle_i32x4(_f6, _f7, _MM_SHUFFLE(2, 0, 2, 0));
                    _tmp4 = _mm512_shuffle_i32x4(_f0, _f1, _MM_SHUFFLE(3, 1, 3, 1));
                    _tmp5 = _mm512_shuffle_i32x4(_f2, _f3, _MM_SHUFFLE(3, 1, 3, 1));
                    _tmp6 = _mm512_shuffle_i32x4(_f4, _f5, _MM_SHUFFLE(3, 1, 3, 1));
                    _tmp7 = _mm512_shuffle_i32x4(_f6, _f7, _MM_SHUFFLE(3, 1, 3, 1));

                    _f0 = _mm512_shuffle_i32x4(_tmp0, _tmp0, _MM_SHUFFLE(3, 1, 2, 0));
                    _f1 = _mm512_shuffle_i32x4(_tmp1, _tmp1, _MM_SHUFFLE(3, 1, 2, 0));
                    _f2 = _mm512_shuffle_i32x4(_tmp2, _tmp2, _MM_SHUFFLE(3, 1, 2, 0));
                    _f3 = _mm512_shuffle_i32x4(_tmp3, _tmp3, _MM_SHUFFLE(3, 1, 2, 0));
                    _f4 = _mm512_shuffle_i32x4(_tmp4, _tmp4, _MM_SHUFFLE(3, 1, 2, 0));
                    _f5 = _mm512_shuffle_i32x4(_tmp5, _tmp5, _MM_SHUFFLE(3, 1, 2, 0));
                    _f6 = _mm512_shuffle_i32x4(_tmp6, _tmp6, _MM_SHUFFLE(3, 1, 2, 0));
                    _f7 = _mm512_shuffle_i32x4(_tmp7, _tmp7, _MM_SHUFFLE(3, 1, 2, 0));

                    _mm512_storeu_si512((__m512i*)p0, _f0);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep), _f1);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 2), _f2);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 3), _f3);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 4), _f4);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 5), _f5);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 6), _f6);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 7), _f7);

                    p0 += 16;
                }
            }
        }
#endif // __AVX512F__
        for (; jj + 7 < max_jj; jj += 8)
        {
#if __AVX2__
            __m256i _f0 = _mm256_load_si256((const __m256i*)pp);
            __m256i _f1 = _mm256_load_si256((const __m256i*)(pp + 8));
            __m256i _f2 = _mm256_load_si256((const __m256i*)(pp + 16));
            __m256i _f3 = _mm256_load_si256((const __m256i*)(pp + 24));
            __m256i _f4 = _mm256_load_si256((const __m256i*)(pp + 32));
            __m256i _f5 = _mm256_load_si256((const __m256i*)(pp + 40));
            __m256i _f6 = _mm256_load_si256((const __m256i*)(pp + 48));
            __m256i _f7 = _mm256_load_si256((const __m256i*)(pp + 56));
            pp += 64;

            // from
            //      00 11 22 33 44 55 66 77
            //      01 12 23 30 45 56 67 74
            //      20 31 02 13 64 75 46 57
            //      21 32 03 10 65 76 47 54
            //      04 15 26 37 40 51 62 73
            //      05 16 27 34 41 52 63 70
            //      24 35 06 17 60 71 42 53
            //      25 36 07 14 61 72 43 50

            // to
            //      00 10 20 30 40 50 60 70
            //      01 11 21 31 41 51 61 71
            //      02 12 22 32 42 52 62 72
            //      03 13 23 33 43 53 63 73
            //      04 14 24 34 44 54 64 74
            //      05 15 25 35 45 55 65 75
            //      06 16 26 36 46 56 66 76
            //      07 17 27 37 47 57 67 77
            {
                __m256i _tmp0 = _f0;
                __m256i _tmp1 = _mm256_shuffle_epi32(_f1, _MM_SHUFFLE(2, 1, 0, 3));
                __m256i _tmp2 = _f2;
                __m256i _tmp3 = _mm256_shuffle_epi32(_f3, _MM_SHUFFLE(2, 1, 0, 3));
                __m256i _tmp4 = _f4;
                __m256i _tmp5 = _mm256_shuffle_epi32(_f5, _MM_SHUFFLE(2, 1, 0, 3));
                __m256i _tmp6 = _f6;
                __m256i _tmp7 = _mm256_shuffle_epi32(_f7, _MM_SHUFFLE(2, 1, 0, 3));

                _f0 = _mm256_unpacklo_epi32(_tmp0, _tmp3);
                _f1 = _mm256_unpackhi_epi32(_tmp0, _tmp3);
                _f2 = _mm256_unpacklo_epi32(_tmp2, _tmp1);
                _f3 = _mm256_unpackhi_epi32(_tmp2, _tmp1);
                _f4 = _mm256_unpacklo_epi32(_tmp4, _tmp7);
                _f5 = _mm256_unpackhi_epi32(_tmp4, _tmp7);
                _f6 = _mm256_unpacklo_epi32(_tmp6, _tmp5);
                _f7 = _mm256_unpackhi_epi32(_tmp6, _tmp5);

                _tmp0 = _mm256_unpacklo_epi64(_f0, _f2);
                _tmp1 = _mm256_unpackhi_epi64(_f0, _f2);
                _tmp2 = _mm256_unpacklo_epi64(_f3, _f1);
                _tmp3 = _mm256_unpackhi_epi64(_f3, _f1);
                _tmp4 = _mm256_unpacklo_epi64(_f4, _f6);
                _tmp5 = _mm256_unpackhi_epi64(_f4, _f6);
                _tmp6 = _mm256_unpacklo_epi64(_f7, _f5);
                _tmp7 = _mm256_unpackhi_epi64(_f7, _f5);

                _tmp1 = _mm256_shuffle_epi32(_tmp1, _MM_SHUFFLE(2, 1, 0, 3));
                _tmp3 = _mm256_shuffle_epi32(_tmp3, _MM_SHUFFLE(2, 1, 0, 3));
                _tmp5 = _mm256_shuffle_epi32(_tmp5, _MM_SHUFFLE(2, 1, 0, 3));
                _tmp7 = _mm256_shuffle_epi32(_tmp7, _MM_SHUFFLE(2, 1, 0, 3));

                _f0 = _mm256_permute2x128_si256(_tmp0, _tmp4, _MM_SHUFFLE(0, 3, 0, 0));
                _f1 = _mm256_permute2x128_si256(_tmp1, _tmp5, _MM_SHUFFLE(0, 3, 0, 0));
                _f2 = _mm256_permute2x128_si256(_tmp2, _tmp6, _MM_SHUFFLE(0, 3, 0, 0));
                _f3 = _mm256_permute2x128_si256(_tmp3, _tmp7, _MM_SHUFFLE(0, 3, 0, 0));
                _f4 = _mm256_permute2x128_si256(_tmp4, _tmp0, _MM_SHUFFLE(0, 3, 0, 0));
                _f5 = _mm256_permute2x128_si256(_tmp5, _tmp1, _MM_SHUFFLE(0, 3, 0, 0));
                _f6 = _mm256_permute2x128_si256(_tmp6, _tmp2, _MM_SHUFFLE(0, 3, 0, 0));
                _f7 = _mm256_permute2x128_si256(_tmp7, _tmp3, _MM_SHUFFLE(0, 3, 0, 0));
            }
#else  // __AVX2__
            __m256i _f0 = _mm256_loadu_si256((const __m256i*)pp);
            __m256i _f1 = _mm256_loadu_si256((const __m256i*)(pp + 8));
            __m256i _f2 = _mm256_loadu_si256((const __m256i*)(pp + 16));
            __m256i _f3 = _mm256_loadu_si256((const __m256i*)(pp + 24));
            __m256i _f4 = _mm256_loadu_si256((const __m256i*)pp1);
            __m256i _f5 = _mm256_loadu_si256((const __m256i*)(pp1 + 8));
            __m256i _f6 = _mm256_loadu_si256((const __m256i*)(pp1 + 16));
            __m256i _f7 = _mm256_loadu_si256((const __m256i*)(pp1 + 24));
            pp += 32;
            pp1 += 32;

            // from
            //      00 11 22 33 04 15 26 37
            //      20 31 02 13 24 35 06 17
            //      01 12 23 30 05 16 27 34
            //      21 32 03 10 25 36 07 14
            //      40 51 62 73 44 55 66 77
            //      60 71 42 53 64 75 46 57
            //      41 52 63 70 45 56 67 74
            //      61 72 43 50 65 76 47 54

            // to
            //      00 10 20 30 40 50 60 70
            //      01 11 21 31 41 51 61 71
            //      02 12 22 32 42 52 62 72
            //      03 13 23 33 43 53 63 73
            //      04 14 24 34 44 54 64 74
            //      05 15 25 35 45 55 65 75
            //      06 16 26 36 46 56 66 76
            //      07 17 27 37 47 57 67 77
            {
                __m256i _tmp0 = _f0;
                __m256i _tmp1 = _f1;
                __m256i _tmp2 = _mm256_castps_si256(_mm256_shuffle_ps(_mm256_castsi256_ps(_f2), _mm256_castsi256_ps(_f2), _MM_SHUFFLE(2, 1, 0, 3)));
                __m256i _tmp3 = _mm256_castps_si256(_mm256_shuffle_ps(_mm256_castsi256_ps(_f3), _mm256_castsi256_ps(_f3), _MM_SHUFFLE(2, 1, 0, 3)));
                __m256i _tmp4 = _f4;
                __m256i _tmp5 = _f5;
                __m256i _tmp6 = _mm256_castps_si256(_mm256_shuffle_ps(_mm256_castsi256_ps(_f6), _mm256_castsi256_ps(_f6), _MM_SHUFFLE(2, 1, 0, 3)));
                __m256i _tmp7 = _mm256_castps_si256(_mm256_shuffle_ps(_mm256_castsi256_ps(_f7), _mm256_castsi256_ps(_f7), _MM_SHUFFLE(2, 1, 0, 3)));

                _f0 = _mm256_permute2f128_si256(_tmp0, _tmp4, _MM_SHUFFLE(0, 2, 0, 0));
                _f1 = _mm256_permute2f128_si256(_tmp1, _tmp5, _MM_SHUFFLE(0, 2, 0, 0));
                _f2 = _mm256_permute2f128_si256(_tmp2, _tmp6, _MM_SHUFFLE(0, 2, 0, 0));
                _f3 = _mm256_permute2f128_si256(_tmp3, _tmp7, _MM_SHUFFLE(0, 2, 0, 0));
                _f4 = _mm256_permute2f128_si256(_tmp0, _tmp4, _MM_SHUFFLE(0, 3, 0, 1));
                _f5 = _mm256_permute2f128_si256(_tmp1, _tmp5, _MM_SHUFFLE(0, 3, 0, 1));
                _f6 = _mm256_permute2f128_si256(_tmp2, _tmp6, _MM_SHUFFLE(0, 3, 0, 1));
                _f7 = _mm256_permute2f128_si256(_tmp3, _tmp7, _MM_SHUFFLE(0, 3, 0, 1));

                _tmp0 = _mm256_castps_si256(_mm256_unpacklo_ps(_mm256_castsi256_ps(_f0), _mm256_castsi256_ps(_f3)));
                _tmp1 = _mm256_castps_si256(_mm256_unpacklo_ps(_mm256_castsi256_ps(_f1), _mm256_castsi256_ps(_f2)));
                _tmp2 = _mm256_castps_si256(_mm256_unpackhi_ps(_mm256_castsi256_ps(_f1), _mm256_castsi256_ps(_f2)));
                _tmp3 = _mm256_castps_si256(_mm256_unpackhi_ps(_mm256_castsi256_ps(_f0), _mm256_castsi256_ps(_f3)));
                _tmp4 = _mm256_castps_si256(_mm256_unpacklo_ps(_mm256_castsi256_ps(_f4), _mm256_castsi256_ps(_f7)));
                _tmp5 = _mm256_castps_si256(_mm256_unpacklo_ps(_mm256_castsi256_ps(_f5), _mm256_castsi256_ps(_f6)));
                _tmp6 = _mm256_castps_si256(_mm256_unpackhi_ps(_mm256_castsi256_ps(_f5), _mm256_castsi256_ps(_f6)));
                _tmp7 = _mm256_castps_si256(_mm256_unpackhi_ps(_mm256_castsi256_ps(_f4), _mm256_castsi256_ps(_f7)));

                _f0 = _mm256_castpd_si256(_mm256_unpacklo_pd(_mm256_castsi256_pd(_tmp0), _mm256_castsi256_pd(_tmp1)));
                _f1 = _mm256_castpd_si256(_mm256_unpackhi_pd(_mm256_castsi256_pd(_tmp0), _mm256_castsi256_pd(_tmp1)));
                _f2 = _mm256_castpd_si256(_mm256_unpacklo_pd(_mm256_castsi256_pd(_tmp2), _mm256_castsi256_pd(_tmp3)));
                _f3 = _mm256_castpd_si256(_mm256_unpackhi_pd(_mm256_castsi256_pd(_tmp2), _mm256_castsi256_pd(_tmp3)));
                _f4 = _mm256_castpd_si256(_mm256_unpacklo_pd(_mm256_castsi256_pd(_tmp4), _mm256_castsi256_pd(_tmp5)));
                _f5 = _mm256_castpd_si256(_mm256_unpackhi_pd(_mm256_castsi256_pd(_tmp4), _mm256_castsi256_pd(_tmp5)));
                _f6 = _mm256_castpd_si256(_mm256_unpacklo_pd(_mm256_castsi256_pd(_tmp6), _mm256_castsi256_pd(_tmp7)));
                _f7 = _mm256_castpd_si256(_mm256_unpackhi_pd(_mm256_castsi256_pd(_tmp6), _mm256_castsi256_pd(_tmp7)));

                _f1 = _mm256_castps_si256(_mm256_shuffle_ps(_mm256_castsi256_ps(_f1), _mm256_castsi256_ps(_f1), _MM_SHUFFLE(2, 1, 0, 3)));
                _f3 = _mm256_castps_si256(_mm256_shuffle_ps(_mm256_castsi256_ps(_f3), _mm256_castsi256_ps(_f3), _MM_SHUFFLE(2, 1, 0, 3)));
                _f5 = _mm256_castps_si256(_mm256_shuffle_ps(_mm256_castsi256_ps(_f5), _mm256_castsi256_ps(_f5), _MM_SHUFFLE(2, 1, 0, 3)));
                _f7 = _mm256_castps_si256(_mm256_shuffle_ps(_mm256_castsi256_ps(_f7), _mm256_castsi256_ps(_f7), _MM_SHUFFLE(2, 1, 0, 3)));
            }
#endif // __AVX2__

            {
                if (out_elempack == 8)
                {
                    _mm256_store_si256((__m256i*)p0, _f0);
                    _mm256_store_si256((__m256i*)(p0 + 8), _f1);
                    _mm256_store_si256((__m256i*)(p0 + 16), _f2);
                    _mm256_store_si256((__m256i*)(p0 + 24), _f3);
                    _mm256_store_si256((__m256i*)(p0 + 32), _f4);
                    _mm256_store_si256((__m256i*)(p0 + 40), _f5);
                    _mm256_store_si256((__m256i*)(p0 + 48), _f6);
                    _mm256_store_si256((__m256i*)(p0 + 56), _f7);
                    p0 += 64;
                }
                if (out_elempack == 4)
                {
                    __m256i _tmp0 = _mm256_permute2f128_si256(_f0, _f1, _MM_SHUFFLE(0, 2, 0, 0));
                    __m256i _tmp1 = _mm256_permute2f128_si256(_f2, _f3, _MM_SHUFFLE(0, 2, 0, 0));
                    __m256i _tmp2 = _mm256_permute2f128_si256(_f4, _f5, _MM_SHUFFLE(0, 2, 0, 0));
                    __m256i _tmp3 = _mm256_permute2f128_si256(_f6, _f7, _MM_SHUFFLE(0, 2, 0, 0));
                    __m256i _tmp4 = _mm256_permute2f128_si256(_f0, _f1, _MM_SHUFFLE(0, 3, 0, 1));
                    __m256i _tmp5 = _mm256_permute2f128_si256(_f2, _f3, _MM_SHUFFLE(0, 3, 0, 1));
                    __m256i _tmp6 = _mm256_permute2f128_si256(_f4, _f5, _MM_SHUFFLE(0, 3, 0, 1));
                    __m256i _tmp7 = _mm256_permute2f128_si256(_f6, _f7, _MM_SHUFFLE(0, 3, 0, 1));

                    _mm256_storeu_si256((__m256i*)p0, _tmp0);
                    _mm256_storeu_si256((__m256i*)(p0 + 8), _tmp1);
                    _mm256_storeu_si256((__m256i*)(p0 + 16), _tmp2);
                    _mm256_storeu_si256((__m256i*)(p0 + 24), _tmp3);
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 4), _tmp4);
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 4 + 8), _tmp5);
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 4 + 16), _tmp6);
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 4 + 24), _tmp7);
                    p0 += 32;
                }
                if (out_elempack == 1)
                {
                    transpose8x8_epi32(_f0, _f1, _f2, _f3, _f4, _f5, _f6, _f7);
                    _mm256_storeu_si256((__m256i*)p0, _f0);
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep), _f1);
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 2), _f2);
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 3), _f3);
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 4), _f4);
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 5), _f5);
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 6), _f6);
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 7), _f7);
                    p0 += 8;
                }
            }
        }
#endif // defined(__x86_64__) || defined(_M_X64)
        for (; jj + 3 < max_jj; jj += 4)
        {
#if __AVX2__
            __m256i _f0 = _mm256_load_si256((const __m256i*)pp);
            __m256i _f1 = _mm256_load_si256((const __m256i*)(pp + 8));
            __m256i _f2 = _mm256_load_si256((const __m256i*)(pp + 16));
            __m256i _f3 = _mm256_load_si256((const __m256i*)(pp + 24));
            pp += 32;
#else
            __m256i _f01l = _mm256_loadu_si256((const __m256i*)pp);
            __m256i _f23l = _mm256_loadu_si256((const __m256i*)(pp + 8));
            __m256i _f01h = _mm256_loadu_si256((const __m256i*)pp1);
            __m256i _f23h = _mm256_loadu_si256((const __m256i*)(pp1 + 8));
            __m256i _f0 = _mm256_permute2f128_si256(_f01l, _f01h, _MM_SHUFFLE(0, 2, 0, 0));
            __m256i _f1 = _mm256_permute2f128_si256(_f01l, _f01h, _MM_SHUFFLE(0, 3, 0, 1));
            __m256i _f2 = _mm256_permute2f128_si256(_f23l, _f23h, _MM_SHUFFLE(0, 2, 0, 0));
            __m256i _f3 = _mm256_permute2f128_si256(_f23l, _f23h, _MM_SHUFFLE(0, 3, 0, 1));
            pp += 16;
            pp1 += 16;
#endif

            // from
            //      00 11 22 33 40 51 62 73
            //      01 12 23 30 41 52 63 70
            //      20 31 02 13 60 71 42 53
            //      21 32 03 10 61 72 43 50
            // to
            //      00 10 20 30 40 50 60 70
            //      01 11 21 31 41 51 61 71
            //      02 12 22 32 42 52 62 72
            //      03 13 23 33 43 53 63 73
            {
#if __AVX2__
                _f1 = _mm256_shuffle_epi32(_f1, _MM_SHUFFLE(2, 1, 0, 3));
                _f3 = _mm256_shuffle_epi32(_f3, _MM_SHUFFLE(2, 1, 0, 3));
                __m256i _tmp0 = _mm256_unpacklo_epi32(_f0, _f3);
                __m256i _tmp1 = _mm256_unpackhi_epi32(_f0, _f3);
                __m256i _tmp2 = _mm256_unpacklo_epi32(_f2, _f1);
                __m256i _tmp3 = _mm256_unpackhi_epi32(_f2, _f1);
                _f0 = _mm256_unpacklo_epi64(_tmp0, _tmp2);
                _f1 = _mm256_unpackhi_epi64(_tmp0, _tmp2);
                _f2 = _mm256_unpacklo_epi64(_tmp3, _tmp1);
                _f3 = _mm256_unpackhi_epi64(_tmp3, _tmp1);
                _f1 = _mm256_shuffle_epi32(_f1, _MM_SHUFFLE(2, 1, 0, 3));
                _f3 = _mm256_shuffle_epi32(_f3, _MM_SHUFFLE(2, 1, 0, 3));
#else
                _f1 = _mm256_castps_si256(_mm256_shuffle_ps(_mm256_castsi256_ps(_f1), _mm256_castsi256_ps(_f1), _MM_SHUFFLE(2, 1, 0, 3)));
                _f3 = _mm256_castps_si256(_mm256_shuffle_ps(_mm256_castsi256_ps(_f3), _mm256_castsi256_ps(_f3), _MM_SHUFFLE(2, 1, 0, 3)));
                __m256 _tmp0 = _mm256_unpacklo_ps(_mm256_castsi256_ps(_f0), _mm256_castsi256_ps(_f3));
                __m256 _tmp1 = _mm256_unpackhi_ps(_mm256_castsi256_ps(_f0), _mm256_castsi256_ps(_f3));
                __m256 _tmp2 = _mm256_unpacklo_ps(_mm256_castsi256_ps(_f2), _mm256_castsi256_ps(_f1));
                __m256 _tmp3 = _mm256_unpackhi_ps(_mm256_castsi256_ps(_f2), _mm256_castsi256_ps(_f1));
                _f0 = _mm256_castps_si256(_mm256_castpd_ps(_mm256_unpacklo_pd(_mm256_castps_pd(_tmp0), _mm256_castps_pd(_tmp2))));
                _f1 = _mm256_castps_si256(_mm256_castpd_ps(_mm256_unpackhi_pd(_mm256_castps_pd(_tmp0), _mm256_castps_pd(_tmp2))));
                _f2 = _mm256_castps_si256(_mm256_castpd_ps(_mm256_unpacklo_pd(_mm256_castps_pd(_tmp3), _mm256_castps_pd(_tmp1))));
                _f3 = _mm256_castps_si256(_mm256_castpd_ps(_mm256_unpackhi_pd(_mm256_castps_pd(_tmp3), _mm256_castps_pd(_tmp1))));
                _f1 = _mm256_castps_si256(_mm256_shuffle_ps(_mm256_castsi256_ps(_f1), _mm256_castsi256_ps(_f1), _MM_SHUFFLE(2, 1, 0, 3)));
                _f3 = _mm256_castps_si256(_mm256_shuffle_ps(_mm256_castsi256_ps(_f3), _mm256_castsi256_ps(_f3), _MM_SHUFFLE(2, 1, 0, 3)));
#endif
            }

            {
                if (out_elempack == 8)
                {
                    _mm256_store_si256((__m256i*)p0, _f0);
                    _mm256_store_si256((__m256i*)(p0 + 8), _f1);
                    _mm256_store_si256((__m256i*)(p0 + 16), _f2);
                    _mm256_store_si256((__m256i*)(p0 + 24), _f3);
                    p0 += 32;
                }
                if (out_elempack == 4)
                {
                    __m256i _tmp0 = _mm256_permute2f128_si256(_f0, _f1, _MM_SHUFFLE(0, 2, 0, 0));
                    __m256i _tmp1 = _mm256_permute2f128_si256(_f2, _f3, _MM_SHUFFLE(0, 2, 0, 0));
                    __m256i _tmp2 = _mm256_permute2f128_si256(_f0, _f1, _MM_SHUFFLE(0, 3, 0, 1));
                    __m256i _tmp3 = _mm256_permute2f128_si256(_f2, _f3, _MM_SHUFFLE(0, 3, 0, 1));

                    _mm256_storeu_si256((__m256i*)p0, _tmp0);
                    _mm256_storeu_si256((__m256i*)(p0 + 8), _tmp1);
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 4), _tmp2);
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 4 + 8), _tmp3);
                    p0 += 16;
                }
                if (out_elempack == 1)
                {
                    transpose8x4_epi32(_f0, _f1, _f2, _f3);
                    _mm_storeu_si128((__m128i*)p0, _mm256_extractf128_si256(_f0, 0));
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep), _mm256_extractf128_si256(_f0, 1));
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep * 2), _mm256_extractf128_si256(_f1, 0));
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep * 3), _mm256_extractf128_si256(_f1, 1));
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep * 4), _mm256_extractf128_si256(_f2, 0));
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep * 5), _mm256_extractf128_si256(_f2, 1));
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep * 6), _mm256_extractf128_si256(_f3, 0));
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep * 7), _mm256_extractf128_si256(_f3, 1));
                    p0 += 4;
                }
            }
        }
        for (; jj + 1 < max_jj; jj += 2)
        {
#if __AVX2__
            __m256i _f0 = _mm256_load_si256((const __m256i*)pp);
            __m256i _f1 = _mm256_load_si256((const __m256i*)(pp + 8));
            pp += 16;
#else
            __m256i _f01l = _mm256_loadu_si256((const __m256i*)pp);
            __m256i _f01h = _mm256_loadu_si256((const __m256i*)pp1);
            __m256i _f0 = _mm256_permute2f128_si256(_f01l, _f01h, _MM_SHUFFLE(0, 2, 0, 0));
            __m256i _f1 = _mm256_permute2f128_si256(_f01l, _f01h, _MM_SHUFFLE(0, 3, 0, 1));
            pp += 8;
            pp1 += 8;
#endif

            // from
            //      00 11 20 31 40 51 60 71
            //      01 10 21 30 41 50 61 70
            // to
            //      00 10 20 30 40 50 60 70
            //      01 11 21 31 41 51 61 71
            {
#if __AVX2__
                __m256i _tmp0 = _mm256_shuffle_epi32(_f0, _MM_SHUFFLE(3, 1, 2, 0));
                __m256i _tmp1 = _mm256_shuffle_epi32(_f1, _MM_SHUFFLE(0, 2, 3, 1));
                _f0 = _mm256_unpacklo_epi32(_tmp0, _tmp1);
                _f1 = _mm256_unpackhi_epi32(_tmp0, _tmp1);
                _f1 = _mm256_shuffle_epi32(_f1, _MM_SHUFFLE(2, 1, 0, 3));
#else
                __m256 _tmp0 = _mm256_shuffle_ps(_mm256_castsi256_ps(_f0), _mm256_castsi256_ps(_f0), _MM_SHUFFLE(3, 1, 2, 0));
                __m256 _tmp1 = _mm256_shuffle_ps(_mm256_castsi256_ps(_f1), _mm256_castsi256_ps(_f1), _MM_SHUFFLE(0, 2, 3, 1));
                _f0 = _mm256_castps_si256(_mm256_unpacklo_ps(_tmp0, _tmp1));
                _f1 = _mm256_castps_si256(_mm256_unpackhi_ps(_tmp0, _tmp1));
                _f1 = _mm256_castps_si256(_mm256_shuffle_ps(_mm256_castsi256_ps(_f1), _mm256_castsi256_ps(_f1), _MM_SHUFFLE(2, 1, 0, 3)));
#endif
            }

            {
                if (out_elempack == 8)
                {
                    _mm256_storeu_si256((__m256i*)p0, _f0);
                    _mm256_storeu_si256((__m256i*)(p0 + 8), _f1);
                    p0 += 16;
                }
                if (out_elempack == 4)
                {
                    __m256i _tmp0 = _mm256_permute2f128_si256(_f0, _f1, _MM_SHUFFLE(0, 2, 0, 0));
                    __m256i _tmp1 = _mm256_permute2f128_si256(_f0, _f1, _MM_SHUFFLE(0, 3, 0, 1));

                    _mm256_storeu_si256((__m256i*)p0, _tmp0);
                    _mm256_storeu_si256((__m256i*)(p0 + out_hstep * 4), _tmp1);
                    p0 += 8;
                }
                if (out_elempack == 1)
                {
#if __AVX512F__
                    __m256i _vindex = _mm256_mullo_epi32(_mm256_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7), _mm256_set1_epi32(out_hstep));
                    _mm256_i32scatter_epi32(p0, _vindex, _f0, sizeof(int));
                    _mm256_i32scatter_epi32(p0 + 1, _vindex, _f1, sizeof(int));
#else
                    int sum0[8];
                    int sum1[8];
                    _mm256_storeu_si256((__m256i*)sum0, _f0);
                    _mm256_storeu_si256((__m256i*)sum1, _f1);

                    p0[0] = sum0[0];
                    p0[1] = sum1[0];
                    p0[out_hstep] = sum0[1];
                    p0[out_hstep + 1] = sum1[1];
                    p0[out_hstep * 2] = sum0[2];
                    p0[out_hstep * 2 + 1] = sum1[2];
                    p0[out_hstep * 3] = sum0[3];
                    p0[out_hstep * 3 + 1] = sum1[3];
                    p0[out_hstep * 4] = sum0[4];
                    p0[out_hstep * 4 + 1] = sum1[4];
                    p0[out_hstep * 5] = sum0[5];
                    p0[out_hstep * 5 + 1] = sum1[5];
                    p0[out_hstep * 6] = sum0[6];
                    p0[out_hstep * 6 + 1] = sum1[6];
                    p0[out_hstep * 7] = sum0[7];
                    p0[out_hstep * 7 + 1] = sum1[7];
#endif // __AVX512F__
                    p0 += 2;
                }
            }
        }
        for (; jj < max_jj; jj++)
        {
#if __AVX2__
            __m256i _f0 = _mm256_load_si256((const __m256i*)pp);
            pp += 8;
#else
            __m128i _f0l = _mm_load_si128((const __m128i*)pp);
            __m128i _f0h = _mm_load_si128((const __m128i*)pp1);
            __m256i _f0 = combine4x2_epi32(_f0l, _f0h);
            pp += 4;
            pp1 += 4;
#endif

            {
                if (out_elempack == 8)
                {
                    _mm256_storeu_si256((__m256i*)p0, _f0);
                    p0 += 8;
                }
                if (out_elempack == 4)
                {
                    _mm_store_si128((__m128i*)p0, _mm256_extractf128_si256(_f0, 0));
                    _mm_store_si128((__m128i*)(p0 + out_hstep * 4), _mm256_extractf128_si256(_f0, 1));
                    p0 += 4;
                }
                if (out_elempack == 1)
                {
#if __AVX512F__
                    __m256i _vindex = _mm256_mullo_epi32(_mm256_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7), _mm256_set1_epi32(out_hstep));
                    _mm256_i32scatter_epi32(p0, _vindex, _f0, sizeof(int));
#else
                    int sum0[8];
                    _mm256_storeu_si256((__m256i*)sum0, _f0);
                    p0[0] = sum0[0];
                    p0[out_hstep] = sum0[1];
                    p0[out_hstep * 2] = sum0[2];
                    p0[out_hstep * 3] = sum0[3];
                    p0[out_hstep * 4] = sum0[4];
                    p0[out_hstep * 5] = sum0[5];
                    p0[out_hstep * 6] = sum0[6];
                    p0[out_hstep * 7] = sum0[7];
#endif // __AVX512F__
                    p0++;
                }
            }
        }

#if !__AVX2__
        pp = pp1;
        pp1 = pp + max_jj * 4;
#endif
    }
#endif // __AVX__
    for (; ii + 3 < max_ii; ii += 4)
    {
        int* p0 = (int*)top_blob + (i + ii) * out_hstep + j * out_elempack;

        int jj = 0;
#if defined(__x86_64__) || defined(_M_X64)
#if __AVX512F__
        for (; jj + 15 < max_jj; jj += 16)
        {
            __m512i _f0 = _mm512_loadu_si512((const __m512i*)pp);
            __m512i _f1 = _mm512_loadu_si512((const __m512i*)(pp + 16));
            __m512i _f2 = _mm512_loadu_si512((const __m512i*)(pp + 32));
            __m512i _f3 = _mm512_loadu_si512((const __m512i*)(pp + 48));

            // from
            //      00 11 22 33 04 15 26 37 08 19 2a 3b 0c 1d 2e 3f
            //      01 12 23 30 05 16 27 34 09 1a 2b 38 0d 1e 2f 3c
            //      20 31 02 13 24 35 06 17 28 3a 0a 1b 2c 3d 0e 1f
            //      21 32 03 10 25 36 07 14 29 3a 0b 18 2d 3e 0f 1c
            // to
            //      00 10 20 30 04 14 24 34 08 18 28 38 0c 1c 2c 3c
            //      01 11 21 31 05 15 25 35 09 19 29 39 0d 1d 2d 3d
            //      02 12 22 32 06 16 26 36 0a 1a 2a 3a 0e 1e 2e 3e
            //      03 13 23 33 07 17 27 37 0b 1b 2b 3b 0f 1f 2f 3f
            {
                _f1 = _mm512_shuffle_epi32(_f1, _MM_PERM_CBAD);
                _f3 = _mm512_shuffle_epi32(_f3, _MM_PERM_CBAD);
                __m512i _tmp0 = _mm512_unpacklo_epi32(_f0, _f3);
                __m512i _tmp1 = _mm512_unpacklo_epi32(_f2, _f1);
                __m512i _tmp2 = _mm512_unpackhi_epi32(_f0, _f3);
                __m512i _tmp3 = _mm512_unpackhi_epi32(_f2, _f1);
                _f0 = _mm512_unpacklo_epi64(_tmp0, _tmp1);
                _f1 = _mm512_unpackhi_epi64(_tmp0, _tmp1);
                _f2 = _mm512_unpacklo_epi64(_tmp3, _tmp2);
                _f3 = _mm512_unpackhi_epi64(_tmp3, _tmp2);
                _f1 = _mm512_shuffle_epi32(_f1, _MM_PERM_CBAD);
                _f3 = _mm512_shuffle_epi32(_f3, _MM_PERM_CBAD);
            }

            {
                if (out_elempack == 4)
                {
                    __m512i _tmp0 = _mm512_shuffle_i32x4(_f0, _f1, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512i _tmp1 = _mm512_shuffle_i32x4(_f2, _f3, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512i _tmp2 = _mm512_shuffle_i32x4(_f0, _f1, _MM_SHUFFLE(3, 2, 3, 2));
                    __m512i _tmp3 = _mm512_shuffle_i32x4(_f2, _f3, _MM_SHUFFLE(3, 2, 3, 2));
                    _f0 = _mm512_shuffle_i32x4(_tmp0, _tmp1, _MM_SHUFFLE(2, 0, 2, 0));
                    _f1 = _mm512_shuffle_i32x4(_tmp0, _tmp1, _MM_SHUFFLE(3, 1, 3, 1));
                    _f2 = _mm512_shuffle_i32x4(_tmp2, _tmp3, _MM_SHUFFLE(2, 0, 2, 0));
                    _f3 = _mm512_shuffle_i32x4(_tmp2, _tmp3, _MM_SHUFFLE(3, 1, 3, 1));

                    _mm512_storeu_si512((__m512i*)p0, _f0);
                    _mm512_storeu_si512((__m512i*)(p0 + 16), _f1);
                    _mm512_storeu_si512((__m512i*)(p0 + 32), _f2);
                    _mm512_storeu_si512((__m512i*)(p0 + 48), _f3);
                    p0 += 64;
                }
                if (out_elempack == 1)
                {
                    __m512i _tmp0 = _mm512_unpacklo_epi32(_f0, _f1);
                    __m512i _tmp1 = _mm512_unpacklo_epi32(_f2, _f3);
                    __m512i _tmp2 = _mm512_unpackhi_epi32(_f0, _f1);
                    __m512i _tmp3 = _mm512_unpackhi_epi32(_f2, _f3);
                    _f0 = _mm512_unpacklo_epi64(_tmp0, _tmp1);
                    _f1 = _mm512_unpackhi_epi64(_tmp0, _tmp1);
                    _f2 = _mm512_unpacklo_epi64(_tmp2, _tmp3);
                    _f3 = _mm512_unpackhi_epi64(_tmp2, _tmp3);

                    _mm512_storeu_si512((__m512i*)p0, _f0);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep), _f1);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 2), _f2);
                    _mm512_storeu_si512((__m512i*)(p0 + out_hstep * 3), _f3);
                    p0 += 16;
                }
            }

            pp += 64;
        }
#endif // __AVX512F__
        for (; jj + 7 < max_jj; jj += 8)
        {
            __m128i _f0 = _mm_load_si128((const __m128i*)pp);
            __m128i _f1 = _mm_load_si128((const __m128i*)(pp + 4));
            __m128i _f2 = _mm_load_si128((const __m128i*)(pp + 8));
            __m128i _f3 = _mm_load_si128((const __m128i*)(pp + 12));
            __m128i _f4 = _mm_load_si128((const __m128i*)(pp + 16));
            __m128i _f5 = _mm_load_si128((const __m128i*)(pp + 20));
            __m128i _f6 = _mm_load_si128((const __m128i*)(pp + 24));
            __m128i _f7 = _mm_load_si128((const __m128i*)(pp + 28));

            // from
            //      00 11 22 33
            //      04 15 26 37
            //      20 31 02 13
            //      24 35 06 17
            //      01 12 23 30
            //      05 16 27 34
            //      21 32 03 10
            //      25 36 07 14
            // to
            //      00 10 20 30
            //      01 11 21 31
            //      02 12 22 32
            //      03 13 23 33
            //      04 14 24 34
            //      05 15 25 35
            //      06 16 26 36
            //      07 17 27 37
            {
                _f4 = _mm_shuffle_epi32(_f4, _MM_SHUFFLE(2, 1, 0, 3));
                _f5 = _mm_shuffle_epi32(_f5, _MM_SHUFFLE(2, 1, 0, 3));
                _f6 = _mm_shuffle_epi32(_f6, _MM_SHUFFLE(2, 1, 0, 3));
                _f7 = _mm_shuffle_epi32(_f7, _MM_SHUFFLE(2, 1, 0, 3));
                __m128i _tmp0 = _mm_unpacklo_epi32(_f0, _f6);
                __m128i _tmp1 = _mm_unpackhi_epi32(_f0, _f6);
                __m128i _tmp2 = _mm_unpacklo_epi32(_f1, _f7);
                __m128i _tmp3 = _mm_unpackhi_epi32(_f1, _f7);
                __m128i _tmp4 = _mm_unpacklo_epi32(_f2, _f4);
                __m128i _tmp5 = _mm_unpackhi_epi32(_f2, _f4);
                __m128i _tmp6 = _mm_unpacklo_epi32(_f3, _f5);
                __m128i _tmp7 = _mm_unpackhi_epi32(_f3, _f5);
                _f0 = _mm_unpacklo_epi64(_tmp0, _tmp4);
                _f1 = _mm_unpackhi_epi64(_tmp0, _tmp4);
                _f2 = _mm_unpacklo_epi64(_tmp5, _tmp1);
                _f3 = _mm_unpackhi_epi64(_tmp5, _tmp1);
                _f4 = _mm_unpacklo_epi64(_tmp2, _tmp6);
                _f5 = _mm_unpackhi_epi64(_tmp2, _tmp6);
                _f6 = _mm_unpacklo_epi64(_tmp7, _tmp3);
                _f7 = _mm_unpackhi_epi64(_tmp7, _tmp3);
                _f1 = _mm_shuffle_epi32(_f1, _MM_SHUFFLE(2, 1, 0, 3));
                _f3 = _mm_shuffle_epi32(_f3, _MM_SHUFFLE(2, 1, 0, 3));
                _f5 = _mm_shuffle_epi32(_f5, _MM_SHUFFLE(2, 1, 0, 3));
                _f7 = _mm_shuffle_epi32(_f7, _MM_SHUFFLE(2, 1, 0, 3));
            }

            {
                if (out_elempack == 4)
                {
                    _mm_store_si128((__m128i*)p0, _f0);
                    _mm_store_si128((__m128i*)(p0 + 4), _f1);
                    _mm_store_si128((__m128i*)(p0 + 8), _f2);
                    _mm_store_si128((__m128i*)(p0 + 12), _f3);
                    _mm_store_si128((__m128i*)(p0 + 16), _f4);
                    _mm_store_si128((__m128i*)(p0 + 20), _f5);
                    _mm_store_si128((__m128i*)(p0 + 24), _f6);
                    _mm_store_si128((__m128i*)(p0 + 28), _f7);
                    p0 += 32;
                }
                if (out_elempack == 1)
                {
                    transpose4x4_epi32(_f0, _f1, _f2, _f3);
                    transpose4x4_epi32(_f4, _f5, _f6, _f7);
                    _mm_storeu_si128((__m128i*)p0, _f0);
                    _mm_storeu_si128((__m128i*)(p0 + 4), _f4);
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep), _f1);
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep + 4), _f5);
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep * 2), _f2);
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep * 2 + 4), _f6);
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep * 3), _f3);
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep * 3 + 4), _f7);
                    p0 += 8;
                }
            }

            pp += 32;
        }
#endif // defined(__x86_64__) || defined(_M_X64)
        for (; jj + 3 < max_jj; jj += 4)
        {
            __m128i _f0 = _mm_load_si128((const __m128i*)pp);
            __m128i _f1 = _mm_load_si128((const __m128i*)(pp + 4));
            __m128i _f2 = _mm_load_si128((const __m128i*)(pp + 8));
            __m128i _f3 = _mm_load_si128((const __m128i*)(pp + 12));

            // from
            //      00 11 22 33
            //      01 12 23 30
            //      20 31 02 13
            //      21 32 03 10
            // to
            //      00 10 20 30
            //      01 11 21 31
            //      02 12 22 32
            //      03 13 23 33
            {
                _f1 = _mm_shuffle_epi32(_f1, _MM_SHUFFLE(2, 1, 0, 3));
                _f3 = _mm_shuffle_epi32(_f3, _MM_SHUFFLE(2, 1, 0, 3));
                __m128i _tmp0 = _mm_unpacklo_epi32(_f0, _f3);
                __m128i _tmp1 = _mm_unpackhi_epi32(_f0, _f3);
                __m128i _tmp2 = _mm_unpacklo_epi32(_f2, _f1);
                __m128i _tmp3 = _mm_unpackhi_epi32(_f2, _f1);
                _f0 = _mm_unpacklo_epi64(_tmp0, _tmp2);
                _f1 = _mm_unpackhi_epi64(_tmp0, _tmp2);
                _f2 = _mm_unpacklo_epi64(_tmp3, _tmp1);
                _f3 = _mm_unpackhi_epi64(_tmp3, _tmp1);
                _f1 = _mm_shuffle_epi32(_f1, _MM_SHUFFLE(2, 1, 0, 3));
                _f3 = _mm_shuffle_epi32(_f3, _MM_SHUFFLE(2, 1, 0, 3));
            }

            {
                if (out_elempack == 4)
                {
                    _mm_store_si128((__m128i*)p0, _f0);
                    _mm_store_si128((__m128i*)(p0 + 4), _f1);
                    _mm_store_si128((__m128i*)(p0 + 8), _f2);
                    _mm_store_si128((__m128i*)(p0 + 12), _f3);
                    p0 += 16;
                }
                if (out_elempack == 1)
                {
                    transpose4x4_epi32(_f0, _f1, _f2, _f3);
                    _mm_storeu_si128((__m128i*)p0, _f0);
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep), _f1);
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep * 2), _f2);
                    _mm_storeu_si128((__m128i*)(p0 + out_hstep * 3), _f3);
                    p0 += 4;
                }
            }

            pp += 16;
        }
        for (; jj + 1 < max_jj; jj += 2)
        {
            __m128i _f0 = _mm_load_si128((const __m128i*)pp);
            __m128i _f1 = _mm_load_si128((const __m128i*)(pp + 4));

            // from
            //      00 11 20 31
            //      01 10 21 30
            // to
            //      00 10 20 30
            //      01 11 21 31
            {
                __m128i _tmp0 = _mm_shuffle_epi32(_f0, _MM_SHUFFLE(3, 1, 2, 0));
                __m128i _tmp1 = _mm_shuffle_epi32(_f1, _MM_SHUFFLE(0, 2, 3, 1));
                _f0 = _mm_unpacklo_epi32(_tmp0, _tmp1);
                _f1 = _mm_unpackhi_epi32(_tmp0, _tmp1);
                _f1 = _mm_shuffle_epi32(_f1, _MM_SHUFFLE(2, 1, 0, 3));
            }

            {
                if (out_elempack == 4)
                {
                    _mm_store_si128((__m128i*)p0, _f0);
                    _mm_store_si128((__m128i*)(p0 + 4), _f1);
                    p0 += 8;
                }
                if (out_elempack == 1)
                {
#if __AVX512F__
                    __m128i _vindex = _mm_mullo_epi32(_mm_setr_epi32(0, 1, 2, 3), _mm_set1_epi32(out_hstep));
                    _mm_i32scatter_epi32(p0, _vindex, _f0, sizeof(int));
                    _mm_i32scatter_epi32(p0 + 1, _vindex, _f1, sizeof(int));
#else
                    int sum0[4];
                    int sum1[4];
                    _mm_storeu_si128((__m128i*)sum0, _f0);
                    _mm_storeu_si128((__m128i*)sum1, _f1);

                    p0[0] = sum0[0];
                    p0[1] = sum1[0];
                    p0[out_hstep] = sum0[1];
                    p0[out_hstep + 1] = sum1[1];
                    p0[out_hstep * 2] = sum0[2];
                    p0[out_hstep * 2 + 1] = sum1[2];
                    p0[out_hstep * 3] = sum0[3];
                    p0[out_hstep * 3 + 1] = sum1[3];
#endif // __AVX512F__
                    p0 += 2;
                }
            }

            pp += 8;
        }
        for (; jj < max_jj; jj++)
        {
            __m128i _f0 = _mm_load_si128((const __m128i*)pp);

            {
                if (out_elempack == 4)
                {
                    _mm_store_si128((__m128i*)p0, _f0);
                    p0 += 4;
                }
                if (out_elempack == 1)
                {
#if __AVX512F__
                    __m128i _vindex = _mm_mullo_epi32(_mm_setr_epi32(0, 1, 2, 3), _mm_set1_epi32(out_hstep));
                    _mm_i32scatter_epi32(p0, _vindex, _f0, sizeof(int));
#else
                    int sum0[4];
                    _mm_storeu_si128((__m128i*)sum0, _f0);
                    p0[0] = sum0[0];
                    p0[out_hstep] = sum0[1];
                    p0[out_hstep * 2] = sum0[2];
                    p0[out_hstep * 3] = sum0[3];
#endif // __AVX512F__
                    p0++;
                }
            }

            pp += 4;
        }
    }
#endif // __SSE2__
    for (; ii + 1 < max_ii; ii += 2)
    {
        int* p0;
        {
            // out_elempack == 1
            p0 = (int*)top_blob + (i + ii) * out_hstep + j;
        }

        int jj = 0;
#if __SSE2__
#if defined(__x86_64__) || defined(_M_X64)
#if __AVX512F__
        for (; jj + 15 < max_jj; jj += 16)
        {
            __m512i _f0 = _mm512_loadu_si512((const __m512i*)pp);
            __m512i _f1 = _mm512_loadu_si512((const __m512i*)(pp + 16));

            // 00 11 02 13  04 15 06 17  08 19 0a 1b  0c 1d 0e 1f
            // 01 12 03 10  05 16 07 14  09 1a 0b 18  0d 1e 0f 1c

            __m512i _tmp0 = _mm512_unpacklo_epi32(_f0, _f1);
            __m512i _tmp1 = _mm512_unpackhi_epi32(_f0, _f1);

            _f0 = _mm512_unpacklo_epi64(_tmp0, _tmp1);
            _f1 = _mm512_unpackhi_epi64(_tmp0, _tmp1);

            _f1 = _mm512_shuffle_epi32(_f1, _MM_PERM_CBAD);

            {
                _mm512_storeu_si512((__m512i*)p0, _f0);
                _mm512_storeu_si512((__m512i*)(p0 + out_hstep), _f1);
                p0 += 16;
            }

            pp += 32;
        }
#endif // __AVX512F__
        for (; jj + 7 < max_jj; jj += 8)
        {
            __m128i _f0 = _mm_load_si128((const __m128i*)pp);
            __m128i _f1 = _mm_load_si128((const __m128i*)(pp + 4));
            __m128i _f2 = _mm_load_si128((const __m128i*)(pp + 8));
            __m128i _f3 = _mm_load_si128((const __m128i*)(pp + 12));

            // 00 11 02 13
            // 04 15 06 17
            // 10 01 12 03
            // 14 05 16 07
            _f2 = _mm_shuffle_epi32(_f2, _MM_SHUFFLE(2, 3, 0, 1));
            _f3 = _mm_shuffle_epi32(_f3, _MM_SHUFFLE(2, 3, 0, 1));

            __m128i _tmp0 = _mm_unpacklo_epi32(_f0, _f2);
            __m128i _tmp1 = _mm_unpackhi_epi32(_f0, _f2);
            __m128i _tmp2 = _mm_unpacklo_epi32(_f1, _f3);
            __m128i _tmp3 = _mm_unpackhi_epi32(_f1, _f3);

            _f0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
            _f1 = _mm_unpacklo_epi64(_tmp2, _tmp3);
            _f2 = _mm_unpackhi_epi64(_tmp0, _tmp1);
            _f3 = _mm_unpackhi_epi64(_tmp2, _tmp3);

            _f2 = _mm_shuffle_epi32(_f2, _MM_SHUFFLE(2, 3, 0, 1));
            _f3 = _mm_shuffle_epi32(_f3, _MM_SHUFFLE(2, 3, 0, 1));

            {
                _mm_storeu_si128((__m128i*)p0, _f0);
                _mm_storeu_si128((__m128i*)(p0 + 4), _f1);
                _mm_storeu_si128((__m128i*)(p0 + out_hstep), _f2);
                _mm_storeu_si128((__m128i*)(p0 + out_hstep + 4), _f3);
                p0 += 8;
            }

            pp += 16;
        }
#endif // defined(__x86_64__) || defined(_M_X64)
        for (; jj + 3 < max_jj; jj += 4)
        {
            __m128i _f0 = _mm_load_si128((const __m128i*)pp);
            __m128i _f1 = _mm_load_si128((const __m128i*)(pp + 4));

            // 00 11 02 13
            // 01 12 03 10
            __m128i _tmp0 = _mm_unpacklo_epi32(_f0, _f1);
            __m128i _tmp1 = _mm_unpackhi_epi32(_f0, _f1);

            _f0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
            _f1 = _mm_unpackhi_epi64(_tmp1, _tmp0);

            _f1 = _mm_shuffle_epi32(_f1, _MM_SHUFFLE(0, 3, 2, 1));

            {
                _mm_storeu_si128((__m128i*)p0, _f0);
                _mm_storeu_si128((__m128i*)(p0 + out_hstep), _f1);
                p0 += 4;
            }

            pp += 8;
        }
#endif // __SSE2__
        for (; jj + 1 < max_jj; jj += 2)
        {
            int f00 = pp[0];
            int f01 = pp[1];
            int f10 = pp[2];
            int f11 = pp[3];

            {
                p0[0] = f00;
                p0[1] = f01;
                p0[out_hstep] = f10;
                p0[out_hstep + 1] = f11;
                p0 += 2;
            }

            pp += 4;
        }
        for (; jj < max_jj; jj++)
        {
            int f0 = pp[0];
            int f1 = pp[1];

            {
                p0[0] = f0;
                p0[out_hstep] = f1;
                p0++;
            }

            pp += 2;
        }
    }
    for (; ii < max_ii; ii += 1)
    {
        int* p0;
        {
            // out_elempack == 1
            p0 = (int*)top_blob + (i + ii) * out_hstep + j;
        }

        int jj = 0;
#if __SSE2__
#if defined(__x86_64__) || defined(_M_X64)
#if __AVX512F__
        for (; jj + 15 < max_jj; jj += 16)
        {
            __m512i _f0 = _mm512_loadu_si512((const __m512i*)pp);

            {
                _mm512_storeu_si512((__m512i*)p0, _f0);
                p0 += 16;
            }

            pp += 16;
        }
#endif // __AVX512F__
        for (; jj + 7 < max_jj; jj += 8)
        {
            __m128i _f0 = _mm_loadu_si128((const __m128i*)pp);
            __m128i _f1 = _mm_loadu_si128((const __m128i*)(pp + 4));

            {
                _mm_storeu_si128((__m128i*)p0, _f0);
                _mm_storeu_si128((__m128i*)(p0 + 4), _f1);
                p0 += 8;
            }

            pp += 8;
        }
#endif // defined(__x86_64__) || defined(_M_X64)
        for (; jj + 3 < max_jj; jj += 4)
        {
            __m128i _f0 = _mm_loadu_si128((const __m128i*)pp);

            {
                _mm_storeu_si128((__m128i*)p0, _f0);
                p0 += 4;
            }

            pp += 4;
        }
#endif // __SSE2__
        for (; jj + 1 < max_jj; jj += 2)
        {
            int f0 = pp[0];
            int f1 = pp[1];

            {
                p0[0] = f0;
                p0[1] = f1;
                p0 += 2;
            }

            pp += 2;
        }
        for (; jj < max_jj; jj++)
        {
            int f0 = pp[0];

            p0[0] = f0;

            {
                p0++;
            }

            pp += 1;
        }
    }
}